

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Sigmoid_x86_avx::forward_inplace(Sigmoid_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [24];
  undefined1 (*pauVar50) [32];
  long in_RSI;
  double dVar51;
  float fVar52;
  float fVar53;
  __m128 _p_3;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  __m256 one_4;
  __m256 one;
  __m128 one_6;
  __m128 one_2;
  __m256 pow2n;
  __m256 y;
  __m256 z;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 pow2n_2;
  __m256 y_2;
  __m256 z_2;
  __m256 mask_2;
  __m256 one_5;
  __m256i imm0_1;
  __m256 fx_2;
  __m256 tmp_2;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf z_1;
  v4sf mask_1;
  v4sf one_3;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n_3;
  v4sf y_3;
  v4sf z_3;
  v4sf mask_3;
  v4sf one_7;
  v4si emm0_1;
  v4sf fx_3;
  v4sf tmp_3;
  undefined8 in_stack_ffffffffffffdbe8;
  Mat *this_00;
  Mat *in_stack_ffffffffffffdbf0;
  int local_23ac;
  Mat local_23a8;
  undefined1 (*local_2360) [32];
  int local_2354;
  void *local_2350;
  int *piStack_2348;
  int local_233c;
  Mat local_2338;
  Mat *local_22f0;
  int local_22e4;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  int local_22a8;
  Mat local_2298;
  undefined1 (*local_2250) [32];
  int local_2248;
  int local_2244;
  int local_2240;
  int local_223c;
  int local_2238;
  int local_2234;
  undefined1 (*local_2210) [32];
  undefined1 (*local_2208) [32];
  undefined1 local_2200 [32];
  undefined1 (*local_21c8) [32];
  undefined1 local_21c0 [32];
  undefined1 (*local_2188) [32];
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined1 (*local_2100) [32];
  Mat *local_20f8;
  undefined1 local_20f0 [16];
  undefined1 (*local_20d8) [32];
  undefined1 local_20d0 [16];
  Mat *local_20b8;
  undefined8 local_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 local_2090;
  undefined8 uStack_2088;
  void *local_2080;
  int *piStack_2078;
  undefined4 local_2068;
  undefined4 local_2064;
  float local_2060;
  float fStack_205c;
  float fStack_2058;
  float fStack_2054;
  float fStack_2050;
  float fStack_204c;
  float fStack_2048;
  float fStack_2044;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  float local_2020;
  float fStack_201c;
  float fStack_2018;
  float fStack_2014;
  float fStack_2010;
  float fStack_200c;
  float fStack_2008;
  float fStack_2004;
  undefined1 local_2000 [32];
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined1 local_1f80 [8];
  float fStack_1f78;
  float fStack_1f74;
  float fStack_1f70;
  float fStack_1f6c;
  float fStack_1f68;
  float fStack_1f64;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  float local_1f20;
  float fStack_1f1c;
  float fStack_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float fStack_1f08;
  float fStack_1f04;
  undefined1 local_1f00 [32];
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1ea0 [8];
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined1 local_1e80 [8];
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined1 local_1e60 [32];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float fStack_1c08;
  float fStack_1c04;
  float local_1c00;
  float fStack_1bfc;
  float fStack_1bf8;
  float fStack_1bf4;
  float fStack_1bf0;
  float fStack_1bec;
  float fStack_1be8;
  float fStack_1be4;
  undefined1 local_1be0 [32];
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined1 local_1b80 [8];
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined1 local_1b60 [8];
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined1 local_1b40 [32];
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  ulong uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  ulong uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined1 local_1720 [32];
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [16];
  undefined1 auStack_1690 [16];
  undefined4 local_1680;
  undefined4 local_167c;
  undefined4 local_1678;
  undefined4 local_1674;
  undefined4 local_1670;
  undefined4 local_166c;
  undefined4 local_1668;
  undefined4 local_1664;
  undefined1 local_1660 [16];
  undefined1 auStack_1650 [16];
  undefined4 local_1640;
  undefined4 local_163c;
  undefined4 local_1638;
  undefined4 local_1634;
  undefined4 local_1630;
  undefined4 local_162c;
  undefined4 local_1628;
  undefined4 local_1624;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined1 local_1500 [32];
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 local_e50;
  undefined8 uStack_e48;
  undefined1 local_e40 [16];
  undefined1 local_e30 [16];
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined1 local_d40 [16];
  undefined1 local_d30 [16];
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined1 local_c70 [16];
  undefined1 local_c60 [16];
  undefined4 local_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined4 local_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined4 local_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined4 local_a64;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined4 local_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined4 local_a24;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined4 local_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a08;
  undefined4 uStack_a04;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 uStack_9ec;
  undefined4 uStack_9e8;
  undefined4 uStack_9e4;
  undefined4 local_9d4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [16];
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [16];
  undefined8 local_990;
  undefined8 uStack_988;
  undefined1 local_980 [16];
  undefined8 local_970;
  undefined8 uStack_968;
  undefined1 local_960 [16];
  undefined8 local_950;
  undefined8 uStack_948;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  undefined8 local_910;
  undefined8 uStack_908;
  undefined1 local_900 [16];
  undefined1 local_8f0 [8];
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined1 local_8d0 [16];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined4 local_894;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  float local_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  undefined1 local_750 [16];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined1 local_730 [16];
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined4 local_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  void *local_4f0;
  int *piStack_4e8;
  undefined8 local_4e0;
  ulong uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  ulong uStack_4b8;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [16];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 local_280 [16];
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_2234 = *(int *)(in_RSI + 0x2c);
  local_2238 = *(int *)(in_RSI + 0x30);
  local_223c = *(int *)(in_RSI + 0x38);
  local_2240 = local_2234 * local_2238;
  local_2244 = *(int *)(in_RSI + 0x18);
  if (local_2244 == 8) {
    local_2244 = 8;
    for (local_2248 = 0; local_2248 < local_223c; local_2248 = local_2248 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffdbf0,(int)((ulong)in_stack_ffffffffffffdbe8 >> 0x20));
      pauVar50 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_2298);
      ncnn::Mat::~Mat((Mat *)0x5094a4);
      local_2250 = pauVar50;
      for (local_22a8 = 0; local_22a8 < local_2240; local_22a8 = local_22a8 + 1) {
        local_2208 = local_2250;
        local_22e0 = *(undefined8 *)*local_2250;
        uStack_22d8 = *(undefined8 *)(*local_2250 + 8);
        uStack_22d0 = *(undefined8 *)(*local_2250 + 0x10);
        uStack_22c8 = *(undefined8 *)(*local_2250 + 0x18);
        local_2188 = local_2250;
        local_2068 = 0x3f800000;
        local_1640 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_1660 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_1650 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_2140 = local_1660._0_8_;
        uStack_2138 = local_1660._8_8_;
        uStack_2130 = auStack_1650._0_8_;
        uStack_2128 = auStack_1650._8_8_;
        local_2040 = local_1660._0_8_;
        uStack_2038 = local_1660._8_8_;
        uStack_2030 = auStack_1650._0_8_;
        uStack_2028 = auStack_1650._8_8_;
        local_1700 = ZEXT832(0) << 0x20;
        local_1780 = 0;
        local_16e0._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1778 = local_16e0._8_8_;
        uStack_1770 = 0;
        uStack_1768 = 0;
        auVar6 = vsubps_avx(ZEXT832((ulong)local_16e0._8_8_) << 0x40,*local_2250);
        local_1ee0 = 0x3f8000003f800000;
        uStack_1ed8 = 0x3f8000003f800000;
        uStack_1ed0 = 0x3f8000003f800000;
        uStack_1ec8 = 0x3f8000003f800000;
        local_1e60._0_8_ = auVar6._0_8_;
        local_15c0 = local_1e60._0_8_;
        local_1e60._8_8_ = auVar6._8_8_;
        uStack_15b8 = local_1e60._8_8_;
        local_1e60._16_8_ = auVar6._16_8_;
        uStack_15b0 = local_1e60._16_8_;
        local_1e60._24_8_ = auVar6._24_8_;
        uStack_15a8 = local_1e60._24_8_;
        local_15e0 = 0x42b0c0a542b0c0a5;
        uStack_15d8 = 0x42b0c0a542b0c0a5;
        uStack_15d0 = 0x42b0c0a542b0c0a5;
        uStack_15c8 = 0x42b0c0a542b0c0a5;
        auVar16._8_8_ = 0x42b0c0a542b0c0a5;
        auVar16._0_8_ = 0x42b0c0a542b0c0a5;
        auVar16._16_8_ = 0x42b0c0a542b0c0a5;
        auVar16._24_8_ = 0x42b0c0a542b0c0a5;
        auVar6 = vminps_avx(auVar6,auVar16);
        local_1e60._0_8_ = auVar6._0_8_;
        local_1540 = local_1e60._0_8_;
        local_1e60._8_8_ = auVar6._8_8_;
        uStack_1538 = local_1e60._8_8_;
        local_1e60._16_8_ = auVar6._16_8_;
        uStack_1530 = local_1e60._16_8_;
        local_1e60._24_8_ = auVar6._24_8_;
        uStack_1528 = local_1e60._24_8_;
        local_1560 = 0xc2b0c0a5c2b0c0a5;
        uStack_1558 = 0xc2b0c0a5c2b0c0a5;
        uStack_1550 = 0xc2b0c0a5c2b0c0a5;
        uStack_1548 = 0xc2b0c0a5c2b0c0a5;
        auVar18._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar18._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar18._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar18._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar6,auVar18);
        local_1e60._0_8_ = auVar4._0_8_;
        uVar7 = local_1e60._0_8_;
        local_1e60._8_8_ = auVar4._8_8_;
        uVar8 = local_1e60._8_8_;
        local_1e60._16_8_ = auVar4._16_8_;
        uVar9 = local_1e60._16_8_;
        local_1e60._24_8_ = auVar4._24_8_;
        uVar10 = local_1e60._24_8_;
        local_fe0 = 0x3fb8aa3b3fb8aa3b;
        uStack_fd8 = 0x3fb8aa3b3fb8aa3b;
        uStack_fd0 = 0x3fb8aa3b3fb8aa3b;
        uStack_fc8 = 0x3fb8aa3b3fb8aa3b;
        local_fc0._0_4_ = auVar4._0_4_;
        local_fc0._4_4_ = auVar4._4_4_;
        uStack_fb8._0_4_ = auVar4._8_4_;
        uStack_fb8._4_4_ = auVar4._12_4_;
        uStack_fb0._0_4_ = auVar4._16_4_;
        uStack_fb0._4_4_ = auVar4._20_4_;
        uStack_fa8._0_4_ = auVar4._24_4_;
        uStack_fa8._4_4_ = auVar4._28_4_;
        local_1ea0._4_4_ = local_fc0._4_4_ * 1.442695;
        local_1ea0._0_4_ = (float)local_fc0 * 1.442695;
        uStack_1e98._0_4_ = (float)uStack_fb8 * 1.442695;
        uStack_1e98._4_4_ = uStack_fb8._4_4_ * 1.442695;
        uStack_1e90._0_4_ = (float)uStack_fb0 * 1.442695;
        uStack_1e90._4_4_ = uStack_fb0._4_4_ * 1.442695;
        auVar49 = _local_1ea0;
        uStack_1e88._0_4_ = (float)uStack_fa8 * 1.442695;
        uStack_1e88._4_4_ = uStack_fa8._4_4_;
        auVar6 = _local_1ea0;
        local_1c60 = local_1ea0;
        uStack_1c58 = uStack_1e98;
        uStack_1e90 = auVar49._16_8_;
        uStack_1c50 = uStack_1e90;
        uStack_1e88 = auVar6._24_8_;
        uStack_1c48 = uStack_1e88;
        local_1dc0 = 0x3f0000003f000000;
        uStack_1db8 = 0x3f0000003f000000;
        uStack_1db0 = 0x3f0000003f000000;
        uStack_1da8 = 0x3f0000003f000000;
        local_1ea0._4_4_ = local_fc0._4_4_ * 1.442695 + 0.5;
        local_1ea0._0_4_ = (float)local_fc0 * 1.442695 + 0.5;
        uStack_1e98._0_4_ = (float)uStack_fb8 * 1.442695 + 0.5;
        uStack_1e98._4_4_ = uStack_fb8._4_4_ * 1.442695 + 0.5;
        uStack_1e90._0_4_ = (float)uStack_fb0 * 1.442695 + 0.5;
        uStack_1e90._4_4_ = uStack_fb0._4_4_ * 1.442695 + 0.5;
        uStack_1e88._0_4_ = (float)uStack_fa8 * 1.442695 + 0.5;
        uStack_1e88._4_4_ = uStack_fa8._4_4_ + 0.5;
        auVar5 = vroundps_avx(_local_1ea0,1);
        auVar6 = vcmpps_avx(_local_1ea0,auVar5,1);
        local_1f00._0_8_ = auVar6._0_8_;
        local_f40 = local_1f00._0_8_;
        local_1f00._8_8_ = auVar6._8_8_;
        uStack_f38 = local_1f00._8_8_;
        local_1f00._16_8_ = auVar6._16_8_;
        uStack_f30 = local_1f00._16_8_;
        local_1f00._24_8_ = auVar6._24_8_;
        uStack_f28 = local_1f00._24_8_;
        local_f60 = 0x3f8000003f800000;
        uStack_f58 = 0x3f8000003f800000;
        uStack_f50 = 0x3f8000003f800000;
        uStack_f48 = 0x3f8000003f800000;
        auVar20._8_8_ = 0x3f8000003f800000;
        auVar20._0_8_ = 0x3f8000003f800000;
        auVar20._16_8_ = 0x3f8000003f800000;
        auVar20._24_8_ = 0x3f8000003f800000;
        local_1f00 = vandps_avx(auVar6,auVar20);
        local_1e80 = auVar5._0_8_;
        local_17c0 = local_1e80;
        uStack_1e78 = auVar5._8_8_;
        uStack_17b8 = uStack_1e78;
        uStack_1e70 = auVar5._16_8_;
        uStack_17b0 = uStack_1e70;
        uStack_1e68 = auVar5._24_8_;
        uStack_17a8 = uStack_1e68;
        local_17e0 = local_1f00._0_8_;
        uStack_17d8 = local_1f00._8_8_;
        uStack_17d0 = local_1f00._16_8_;
        uStack_17c8 = local_1f00._24_8_;
        _local_1ea0 = vsubps_avx(auVar5,local_1f00);
        local_1020 = 0x3f3180003f318000;
        uStack_1018 = 0x3f3180003f318000;
        uStack_1010 = 0x3f3180003f318000;
        uStack_1008 = 0x3f3180003f318000;
        local_1000._0_4_ = local_1ea0._0_4_;
        local_1000._4_4_ = local_1ea0._4_4_;
        uStack_ff8._0_4_ = local_1ea0._8_4_;
        uStack_ff8._4_4_ = local_1ea0._12_4_;
        uStack_ff0._0_4_ = local_1ea0._16_4_;
        uStack_ff0._4_4_ = local_1ea0._20_4_;
        uStack_fe8._0_4_ = local_1ea0._24_4_;
        uStack_fe8._4_4_ = local_1ea0._28_4_;
        local_1e80._4_4_ = local_1000._4_4_ * 0.6933594;
        local_1e80._0_4_ = (float)local_1000 * 0.6933594;
        uStack_1e78._0_4_ = (float)uStack_ff8 * 0.6933594;
        uStack_1e78._4_4_ = uStack_ff8._4_4_ * 0.6933594;
        uStack_1e70._0_4_ = (float)uStack_ff0 * 0.6933594;
        uStack_1e70._4_4_ = uStack_ff0._4_4_ * 0.6933594;
        auVar49 = _local_1e80;
        uStack_1e68._0_4_ = (float)uStack_fe8 * 0.6933594;
        uStack_1e68._4_4_ = uStack_fe8._4_4_;
        auVar5 = _local_1e80;
        local_1040 = local_1ea0;
        uStack_1038 = uStack_1e98;
        uStack_1030 = uStack_1e90;
        uStack_1028 = uStack_1e88;
        local_1060 = 0xb95e8083b95e8083;
        uStack_1058 = 0xb95e8083b95e8083;
        uStack_1050 = 0xb95e8083b95e8083;
        uStack_1048 = 0xb95e8083b95e8083;
        local_1800 = local_1e60._0_8_;
        uStack_17f8 = local_1e60._8_8_;
        uStack_17f0 = local_1e60._16_8_;
        uStack_17e8 = local_1e60._24_8_;
        local_1820 = local_1e80;
        uStack_1818 = uStack_1e78;
        uStack_1e70 = auVar49._16_8_;
        uStack_1810 = uStack_1e70;
        uStack_1e68 = auVar5._24_8_;
        uStack_1808 = uStack_1e68;
        auVar14._16_8_ = uStack_1e70;
        auVar14._0_16_ = _local_1e80;
        auVar14._24_8_ = uStack_1e68;
        auVar6 = vsubps_avx(auVar4,auVar14);
        local_1e60._0_8_ = auVar6._0_8_;
        local_1840 = local_1e60._0_8_;
        local_1e60._8_8_ = auVar6._8_8_;
        uStack_1838 = local_1e60._8_8_;
        local_1e60._16_8_ = auVar6._16_8_;
        uStack_1830 = local_1e60._16_8_;
        local_1e60._24_8_ = auVar6._24_8_;
        uStack_1828 = local_1e60._24_8_;
        local_1860 = CONCAT44(local_1000._4_4_ * -0.00021219444,(float)local_1000 * -0.00021219444);
        uStack_1858 = CONCAT44(uStack_ff8._4_4_ * -0.00021219444,(float)uStack_ff8 * -0.00021219444)
        ;
        uStack_1850 = CONCAT44(uStack_ff0._4_4_ * -0.00021219444,(float)uStack_ff0 * -0.00021219444)
        ;
        uStack_1848 = CONCAT44(uStack_fe8._4_4_,(float)uStack_fe8 * -0.00021219444);
        auVar13._8_8_ = uStack_1858;
        auVar13._0_8_ = local_1860;
        auVar13._16_8_ = uStack_1850;
        auVar13._24_8_ = uStack_1848;
        local_1e60 = vsubps_avx(auVar6,auVar13);
        local_10a0 = local_1e60._0_8_;
        uStack_1098 = local_1e60._8_8_;
        uStack_1090 = local_1e60._16_8_;
        uStack_1088 = local_1e60._24_8_;
        local_1080._0_4_ = local_1e60._0_4_;
        local_1080._4_4_ = local_1e60._4_4_;
        uStack_1078._0_4_ = local_1e60._8_4_;
        uStack_1078._4_4_ = local_1e60._12_4_;
        uStack_1070._0_4_ = local_1e60._16_4_;
        uStack_1070._4_4_ = local_1e60._20_4_;
        uStack_1068._0_4_ = local_1e60._24_4_;
        uStack_1068._4_4_ = local_1e60._28_4_;
        fStack_1f04 = uStack_1068._4_4_;
        local_1f20 = (float)local_1080 * (float)local_1080;
        fStack_1f1c = local_1080._4_4_ * local_1080._4_4_;
        fStack_1f18 = (float)uStack_1078 * (float)uStack_1078;
        fStack_1f14 = uStack_1078._4_4_ * uStack_1078._4_4_;
        fStack_1f10 = (float)uStack_1070 * (float)uStack_1070;
        fStack_1f0c = uStack_1070._4_4_ * uStack_1070._4_4_;
        fStack_1f08 = (float)uStack_1068 * (float)uStack_1068;
        local_10c0 = 0x3950696739506967;
        uStack_10b8 = 0x3950696739506967;
        uStack_10b0 = 0x3950696739506967;
        uStack_10a8 = 0x3950696739506967;
        local_10e0 = local_1e60._0_8_;
        uStack_10d8 = local_1e60._8_8_;
        uStack_10d0 = local_1e60._16_8_;
        uStack_10c8 = local_1e60._24_8_;
        local_1f40 = CONCAT44(local_1080._4_4_ * 0.00019875691,(float)local_1080 * 0.00019875691);
        uStack_1f38 = CONCAT44(uStack_1078._4_4_ * 0.00019875691,(float)uStack_1078 * 0.00019875691)
        ;
        uStack_1f30 = CONCAT44(uStack_1070._4_4_ * 0.00019875691,(float)uStack_1070 * 0.00019875691)
        ;
        uStack_1f28 = CONCAT44(0x39506967,(float)uStack_1068 * 0.00019875691);
        local_1ca0 = local_1f40;
        uStack_1c98 = uStack_1f38;
        uStack_1c90 = uStack_1f30;
        uStack_1c88 = uStack_1f28;
        local_1cc0 = 0x3ab743ce3ab743ce;
        uStack_1cb8 = 0x3ab743ce3ab743ce;
        uStack_1cb0 = 0x3ab743ce3ab743ce;
        uStack_1ca8 = 0x3ab743ce3ab743ce;
        local_2060 = (float)local_1080 * 0.00019875691 + 0.0013981999;
        fStack_205c = local_1080._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_2058 = (float)uStack_1078 * 0.00019875691 + 0.0013981999;
        fStack_2054 = uStack_1078._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_2050 = (float)uStack_1070 * 0.00019875691 + 0.0013981999;
        fStack_204c = uStack_1070._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_2048 = (float)uStack_1068 * 0.00019875691 + 0.0013981999;
        local_1f40 = CONCAT44(fStack_205c,local_2060);
        uStack_1f38 = CONCAT44(fStack_2054,fStack_2058);
        uStack_1f30 = CONCAT44(fStack_204c,fStack_2050);
        uStack_1f28 = CONCAT44(0x3ad150fb,fStack_2048);
        local_1100 = local_1f40;
        uStack_10f8 = uStack_1f38;
        uStack_10f0 = uStack_1f30;
        uStack_10e8 = uStack_1f28;
        local_1120 = local_1e60._0_8_;
        uStack_1118 = local_1e60._8_8_;
        uStack_1110 = local_1e60._16_8_;
        uStack_1108 = local_1e60._24_8_;
        local_2060 = local_2060 * (float)local_1080;
        fStack_205c = fStack_205c * local_1080._4_4_;
        fStack_2058 = fStack_2058 * (float)uStack_1078;
        fStack_2054 = fStack_2054 * uStack_1078._4_4_;
        fStack_2050 = fStack_2050 * (float)uStack_1070;
        fStack_204c = fStack_204c * uStack_1070._4_4_;
        fStack_2048 = fStack_2048 * (float)uStack_1068;
        local_1f40 = CONCAT44(fStack_205c,local_2060);
        uStack_1f38 = CONCAT44(fStack_2054,fStack_2058);
        uStack_1f30 = CONCAT44(fStack_204c,fStack_2050);
        uStack_1f28 = CONCAT44(0x3ad150fb,fStack_2048);
        local_1ce0 = local_1f40;
        uStack_1cd8 = uStack_1f38;
        uStack_1cd0 = uStack_1f30;
        uStack_1cc8 = uStack_1f28;
        local_1d00 = 0x3c0889083c088908;
        uStack_1cf8 = 0x3c0889083c088908;
        uStack_1cf0 = 0x3c0889083c088908;
        uStack_1ce8 = 0x3c0889083c088908;
        local_2060 = local_2060 + 0.008333452;
        fStack_205c = fStack_205c + 0.008333452;
        fStack_2058 = fStack_2058 + 0.008333452;
        fStack_2054 = fStack_2054 + 0.008333452;
        fStack_2050 = fStack_2050 + 0.008333452;
        fStack_204c = fStack_204c + 0.008333452;
        fStack_2048 = fStack_2048 + 0.008333452;
        local_1f40 = CONCAT44(fStack_205c,local_2060);
        uStack_1f38 = CONCAT44(fStack_2054,fStack_2058);
        uStack_1f30 = CONCAT44(fStack_204c,fStack_2050);
        uStack_1f28 = CONCAT44(0x3c22b327,fStack_2048);
        local_1140 = local_1f40;
        uStack_1138 = uStack_1f38;
        uStack_1130 = uStack_1f30;
        uStack_1128 = uStack_1f28;
        local_1160 = local_1e60._0_8_;
        uStack_1158 = local_1e60._8_8_;
        uStack_1150 = local_1e60._16_8_;
        uStack_1148 = local_1e60._24_8_;
        local_2060 = local_2060 * (float)local_1080;
        fStack_205c = fStack_205c * local_1080._4_4_;
        fStack_2058 = fStack_2058 * (float)uStack_1078;
        fStack_2054 = fStack_2054 * uStack_1078._4_4_;
        fStack_2050 = fStack_2050 * (float)uStack_1070;
        fStack_204c = fStack_204c * uStack_1070._4_4_;
        fStack_2048 = fStack_2048 * (float)uStack_1068;
        local_1f40 = CONCAT44(fStack_205c,local_2060);
        uStack_1f38 = CONCAT44(fStack_2054,fStack_2058);
        uStack_1f30 = CONCAT44(fStack_204c,fStack_2050);
        uStack_1f28 = CONCAT44(0x3c22b327,fStack_2048);
        local_1d20 = local_1f40;
        uStack_1d18 = uStack_1f38;
        uStack_1d10 = uStack_1f30;
        uStack_1d08 = uStack_1f28;
        local_1d40 = 0x3d2aa9c13d2aa9c1;
        uStack_1d38 = 0x3d2aa9c13d2aa9c1;
        uStack_1d30 = 0x3d2aa9c13d2aa9c1;
        uStack_1d28 = 0x3d2aa9c13d2aa9c1;
        local_2060 = local_2060 + 0.041665796;
        fStack_205c = fStack_205c + 0.041665796;
        fStack_2058 = fStack_2058 + 0.041665796;
        fStack_2054 = fStack_2054 + 0.041665796;
        fStack_2050 = fStack_2050 + 0.041665796;
        fStack_204c = fStack_204c + 0.041665796;
        fStack_2048 = fStack_2048 + 0.041665796;
        local_1f40 = CONCAT44(fStack_205c,local_2060);
        uStack_1f38 = CONCAT44(fStack_2054,fStack_2058);
        uStack_1f30 = CONCAT44(fStack_204c,fStack_2050);
        uStack_1f28 = CONCAT44(0x3d53568b,fStack_2048);
        local_1180 = local_1f40;
        uStack_1178 = uStack_1f38;
        uStack_1170 = uStack_1f30;
        uStack_1168 = uStack_1f28;
        local_11a0 = local_1e60._0_8_;
        uStack_1198 = local_1e60._8_8_;
        uStack_1190 = local_1e60._16_8_;
        uStack_1188 = local_1e60._24_8_;
        local_2060 = local_2060 * (float)local_1080;
        fStack_205c = fStack_205c * local_1080._4_4_;
        fStack_2058 = fStack_2058 * (float)uStack_1078;
        fStack_2054 = fStack_2054 * uStack_1078._4_4_;
        fStack_2050 = fStack_2050 * (float)uStack_1070;
        fStack_204c = fStack_204c * uStack_1070._4_4_;
        fStack_2048 = fStack_2048 * (float)uStack_1068;
        local_1f40 = CONCAT44(fStack_205c,local_2060);
        uStack_1f38 = CONCAT44(fStack_2054,fStack_2058);
        uStack_1f30 = CONCAT44(fStack_204c,fStack_2050);
        uStack_1f28 = CONCAT44(0x3d53568b,fStack_2048);
        local_1d60 = local_1f40;
        uStack_1d58 = uStack_1f38;
        uStack_1d50 = uStack_1f30;
        uStack_1d48 = uStack_1f28;
        local_1d80 = 0x3e2aaaaa3e2aaaaa;
        uStack_1d78 = 0x3e2aaaaa3e2aaaaa;
        uStack_1d70 = 0x3e2aaaaa3e2aaaaa;
        uStack_1d68 = 0x3e2aaaaa3e2aaaaa;
        local_2060 = local_2060 + 0.16666666;
        fStack_205c = fStack_205c + 0.16666666;
        fStack_2058 = fStack_2058 + 0.16666666;
        fStack_2054 = fStack_2054 + 0.16666666;
        fStack_2050 = fStack_2050 + 0.16666666;
        fStack_204c = fStack_204c + 0.16666666;
        fStack_2048 = fStack_2048 + 0.16666666;
        local_1f40 = CONCAT44(fStack_205c,local_2060);
        uStack_1f38 = CONCAT44(fStack_2054,fStack_2058);
        uStack_1f30 = CONCAT44(fStack_204c,fStack_2050);
        uStack_1f28 = CONCAT44(0x3e5f804d,fStack_2048);
        local_11c0 = local_1f40;
        uStack_11b8 = uStack_1f38;
        uStack_11b0 = uStack_1f30;
        uStack_11a8 = uStack_1f28;
        local_11e0 = local_1e60._0_8_;
        uStack_11d8 = local_1e60._8_8_;
        uStack_11d0 = local_1e60._16_8_;
        uStack_11c8 = local_1e60._24_8_;
        local_2060 = local_2060 * (float)local_1080;
        fStack_205c = fStack_205c * local_1080._4_4_;
        fStack_2058 = fStack_2058 * (float)uStack_1078;
        fStack_2054 = fStack_2054 * uStack_1078._4_4_;
        fStack_2050 = fStack_2050 * (float)uStack_1070;
        fStack_204c = fStack_204c * uStack_1070._4_4_;
        fStack_2048 = fStack_2048 * (float)uStack_1068;
        local_1f40 = CONCAT44(fStack_205c,local_2060);
        uStack_1f38 = CONCAT44(fStack_2054,fStack_2058);
        uStack_1f30 = CONCAT44(fStack_204c,fStack_2050);
        uStack_1f28 = CONCAT44(0x3e5f804d,fStack_2048);
        local_1da0 = local_1f40;
        uStack_1d98 = uStack_1f38;
        uStack_1d90 = uStack_1f30;
        uStack_1d88 = uStack_1f28;
        local_2060 = local_2060 + 0.5;
        fStack_205c = fStack_205c + 0.5;
        fStack_2058 = fStack_2058 + 0.5;
        fStack_2054 = fStack_2054 + 0.5;
        fStack_2050 = fStack_2050 + 0.5;
        fStack_204c = fStack_204c + 0.5;
        fStack_2048 = fStack_2048 + 0.5;
        local_1f40 = CONCAT44(fStack_205c,local_2060);
        uStack_1f38 = CONCAT44(fStack_2054,fStack_2058);
        uStack_1f30 = CONCAT44(fStack_204c,fStack_2050);
        uStack_1f28 = CONCAT44(0x3f37e013,fStack_2048);
        local_1200 = local_1f40;
        uStack_11f8 = uStack_1f38;
        uStack_11f0 = uStack_1f30;
        uStack_11e8 = uStack_1f28;
        local_1220 = CONCAT44(fStack_1f1c,local_1f20);
        uStack_1218 = CONCAT44(fStack_1f14,fStack_1f18);
        uStack_1210 = CONCAT44(fStack_1f0c,fStack_1f10);
        uStack_1208 = CONCAT44(uStack_1068._4_4_,fStack_1f08);
        local_2060 = local_2060 * local_1f20;
        fStack_205c = fStack_205c * fStack_1f1c;
        fStack_2058 = fStack_2058 * fStack_1f18;
        fStack_2054 = fStack_2054 * fStack_1f14;
        fStack_2050 = fStack_2050 * fStack_1f10;
        fStack_204c = fStack_204c * fStack_1f0c;
        fStack_2048 = fStack_2048 * fStack_1f08;
        local_1f40 = CONCAT44(fStack_205c,local_2060);
        uStack_1f38 = CONCAT44(fStack_2054,fStack_2058);
        uStack_1f30 = CONCAT44(fStack_204c,fStack_2050);
        uStack_1f28 = CONCAT44(0x3f37e013,fStack_2048);
        local_1de0 = local_1f40;
        uStack_1dd8 = uStack_1f38;
        uStack_1dd0 = uStack_1f30;
        uStack_1dc8 = uStack_1f28;
        local_1e00 = local_1e60._0_8_;
        uStack_1df8 = local_1e60._8_8_;
        uStack_1df0 = local_1e60._16_8_;
        uStack_1de8 = local_1e60._24_8_;
        local_2060 = local_2060 + (float)local_1080;
        fStack_205c = fStack_205c + local_1080._4_4_;
        fStack_2058 = fStack_2058 + (float)uStack_1078;
        fStack_2054 = fStack_2054 + uStack_1078._4_4_;
        fStack_2050 = fStack_2050 + (float)uStack_1070;
        fStack_204c = fStack_204c + uStack_1070._4_4_;
        fStack_2048 = fStack_2048 + (float)uStack_1068;
        local_1f40 = CONCAT44(fStack_205c,local_2060);
        uStack_1f38 = CONCAT44(fStack_2054,fStack_2058);
        uStack_1f30 = CONCAT44(fStack_204c,fStack_2050);
        uStack_1f28 = CONCAT44(uStack_1068._4_4_ + 0.71826285,fStack_2048);
        local_1e20 = local_1f40;
        uStack_1e18 = uStack_1f38;
        uStack_1e10 = uStack_1f30;
        uStack_1e08 = uStack_1f28;
        local_1e40 = 0x3f8000003f800000;
        uStack_1e38 = 0x3f8000003f800000;
        uStack_1e30 = 0x3f8000003f800000;
        uStack_1e28 = 0x3f8000003f800000;
        local_2060 = local_2060 + 1.0;
        fStack_205c = fStack_205c + 1.0;
        fStack_2058 = fStack_2058 + 1.0;
        fStack_2054 = fStack_2054 + 1.0;
        fStack_2050 = fStack_2050 + 1.0;
        fStack_204c = fStack_204c + 1.0;
        fStack_2048 = fStack_2048 + 1.0;
        fStack_2044 = uStack_1068._4_4_ + 0.71826285 + 1.0;
        local_1f40 = CONCAT44(fStack_205c,local_2060);
        uStack_1f38 = CONCAT44(fStack_2054,fStack_2058);
        uStack_1f30 = CONCAT44(fStack_204c,fStack_2050);
        uStack_1f28 = CONCAT44(fStack_2044,fStack_2048);
        local_f00 = local_1ea0;
        uStack_ef8 = uStack_1e98;
        uStack_ef0 = uStack_1e90;
        uStack_ee8 = uStack_1e88;
        local_1ec0 = CONCAT44((int)local_1000._4_4_,(int)(float)local_1000);
        uStack_1eb8 = CONCAT44((int)uStack_ff8._4_4_,(int)(float)uStack_ff8);
        uStack_1eb0 = CONCAT44((int)uStack_ff0._4_4_,(int)(float)uStack_ff0);
        uStack_1ea8 = CONCAT44((int)uStack_fe8._4_4_,(int)(float)uStack_fe8);
        local_d00 = local_1ec0;
        uStack_cf8 = uStack_1eb8;
        uStack_cf0 = uStack_1eb0;
        uStack_ce8 = uStack_1ea8;
        local_d20 = 0x7f0000007f;
        uStack_d18 = 0x7f0000007f;
        uStack_d10 = 0x7f0000007f;
        uStack_d08 = 0x7f0000007f;
        local_da0 = local_1ec0;
        uStack_d98 = uStack_1eb8;
        uStack_d90 = uStack_1eb0;
        uStack_d88 = uStack_1ea8;
        local_dc0 = 0x7f0000007f;
        uStack_db8 = 0x7f0000007f;
        uStack_db0 = 0x7f0000007f;
        uStack_da8 = 0x7f0000007f;
        local_d50 = 0x7f0000007f;
        uStack_d48 = 0x7f0000007f;
        local_d60 = 0x7f0000007f;
        uStack_d58 = 0x7f0000007f;
        local_ae0 = local_1ec0;
        uStack_ad8 = uStack_1eb8;
        local_af0 = 0x7f0000007f;
        uStack_ae8 = 0x7f0000007f;
        auVar24._8_8_ = uStack_1eb8;
        auVar24._0_8_ = local_1ec0;
        auVar23._8_8_ = 0x7f0000007f;
        auVar23._0_8_ = 0x7f0000007f;
        local_d30 = vpaddd_avx(auVar24,auVar23);
        local_b00 = uStack_1eb0;
        uStack_af8 = uStack_1ea8;
        local_b10 = 0x7f0000007f;
        uStack_b08 = 0x7f0000007f;
        auVar22._8_8_ = uStack_1ea8;
        auVar22._0_8_ = uStack_1eb0;
        auVar21._8_8_ = 0x7f0000007f;
        auVar21._0_8_ = 0x7f0000007f;
        local_d40 = vpaddd_avx(auVar22,auVar21);
        local_de0 = local_d30._0_8_;
        uStack_dd8 = local_d30._8_8_;
        uStack_dd0 = local_d40._0_8_;
        uStack_dc8 = local_d40._8_8_;
        local_d80 = local_d30._0_8_;
        uStack_d78 = local_d30._8_8_;
        uStack_d70 = local_d40._0_8_;
        uStack_d68 = local_d40._8_8_;
        local_b80 = local_d30._0_8_;
        uStack_b78 = local_d30._8_8_;
        uStack_b70 = local_d40._0_8_;
        uStack_b68 = local_d40._8_8_;
        local_b84 = 0x17;
        local_c00 = local_d30._0_8_;
        uStack_bf8 = local_d30._8_8_;
        uStack_bf0 = local_d40._0_8_;
        uStack_be8 = local_d40._8_8_;
        local_a60 = local_d30._0_8_;
        uStack_a58 = local_d30._8_8_;
        local_a64 = 0x17;
        local_ba0 = vpslld_avx(local_d30,ZEXT416(0x17));
        local_a80 = local_d40._0_8_;
        uStack_a78 = local_d40._8_8_;
        local_a84 = 0x17;
        local_bb0 = vpslld_avx(local_d40,ZEXT416(0x17));
        local_c20 = local_ba0._0_8_;
        uStack_c18 = local_ba0._8_8_;
        uStack_c10 = local_bb0._0_8_;
        uStack_c08 = local_bb0._8_8_;
        local_be0 = local_ba0._0_8_;
        uStack_bd8 = local_ba0._8_8_;
        uStack_bd0 = local_bb0._0_8_;
        uStack_bc8 = local_bb0._8_8_;
        local_1ec0 = local_ba0._0_8_;
        uStack_1eb8 = local_ba0._8_8_;
        uStack_1eb0 = local_bb0._0_8_;
        uStack_1ea8 = local_bb0._8_8_;
        local_b40 = local_ba0._0_8_;
        uStack_b38 = local_ba0._8_8_;
        uStack_b30 = local_bb0._0_8_;
        uStack_b28 = local_bb0._8_8_;
        local_1f60 = local_ba0._0_8_;
        uStack_1f58 = local_ba0._8_8_;
        uStack_1f50 = local_bb0._0_8_;
        uStack_1f48 = local_bb0._8_8_;
        local_1240 = local_1f40;
        uStack_1238 = uStack_1f38;
        uStack_1230 = uStack_1f30;
        uStack_1228 = uStack_1f28;
        local_1260._0_4_ = local_ba0._0_4_;
        local_1260._4_4_ = local_ba0._4_4_;
        uStack_1258._0_4_ = local_ba0._8_4_;
        uStack_1258._4_4_ = local_ba0._12_4_;
        uStack_1250._0_4_ = local_bb0._0_4_;
        uStack_1250._4_4_ = local_bb0._4_4_;
        uStack_1248._0_4_ = local_bb0._8_4_;
        local_2060 = local_2060 * (float)local_1260;
        fStack_205c = fStack_205c * local_1260._4_4_;
        fStack_2058 = fStack_2058 * (float)uStack_1258;
        fStack_2054 = fStack_2054 * uStack_1258._4_4_;
        fStack_2050 = fStack_2050 * (float)uStack_1250;
        fStack_204c = fStack_204c * uStack_1250._4_4_;
        fStack_2048 = fStack_2048 * (float)uStack_1248;
        local_1f40 = CONCAT44(fStack_205c,local_2060);
        uStack_1f38 = CONCAT44(fStack_2054,fStack_2058);
        uStack_1f30 = CONCAT44(fStack_204c,fStack_2050);
        uStack_1f28 = CONCAT44(fStack_2044,fStack_2048);
        local_1fe0 = local_1f40;
        uStack_1fd8 = uStack_1f38;
        uStack_1fd0 = uStack_1f30;
        uStack_1fc8 = uStack_1f28;
        local_1fc0._0_4_ = local_1660._0_4_;
        local_1fc0._4_4_ = local_1660._4_4_;
        uStack_1fb8._0_4_ = local_1660._8_4_;
        uStack_1fb8._4_4_ = local_1660._12_4_;
        uStack_1fb0._0_4_ = auStack_1650._0_4_;
        uStack_1fb0._4_4_ = auStack_1650._4_4_;
        uStack_1fa8._0_4_ = auStack_1650._8_4_;
        uStack_1fa8._4_4_ = auStack_1650._12_4_;
        local_2060 = (float)local_1fc0 + local_2060;
        fStack_205c = local_1fc0._4_4_ + fStack_205c;
        fStack_2058 = (float)uStack_1fb8 + fStack_2058;
        fStack_2054 = uStack_1fb8._4_4_ + fStack_2054;
        fStack_2050 = (float)uStack_1fb0 + fStack_2050;
        fStack_204c = uStack_1fb0._4_4_ + fStack_204c;
        fStack_2048 = (float)uStack_1fa8 + fStack_2048;
        fStack_2044 = uStack_1fa8._4_4_ + fStack_2044;
        auVar12._16_8_ = auStack_1650._0_8_;
        auVar12._0_16_ = local_1660;
        auVar12._24_8_ = auStack_1650._8_8_;
        auVar11._4_4_ = fStack_205c;
        auVar11._0_4_ = local_2060;
        auVar11._8_4_ = fStack_2058;
        auVar11._12_4_ = fStack_2054;
        auVar11._16_4_ = fStack_2050;
        auVar11._20_4_ = fStack_204c;
        auVar11._24_4_ = fStack_2048;
        auVar11._28_4_ = fStack_2044;
        local_21c0 = vdivps_avx(auVar12,auVar11);
        *local_2250 = local_21c0;
        local_2250 = local_2250 + 1;
        local_2120 = local_22e0;
        uStack_2118 = uStack_22d8;
        uStack_2110 = uStack_22d0;
        uStack_2108 = uStack_22c8;
        local_1fc0 = local_2040;
        uStack_1fb8 = uStack_2038;
        uStack_1fb0 = uStack_2030;
        uStack_1fa8 = uStack_2028;
        _local_1e80 = auVar5;
        local_1c80 = local_1dc0;
        uStack_1c78 = uStack_1db8;
        uStack_1c70 = uStack_1db0;
        uStack_1c68 = uStack_1da8;
        local_17a0 = local_22e0;
        uStack_1798 = uStack_22d8;
        uStack_1790 = uStack_22d0;
        uStack_1788 = uStack_22c8;
        local_16e0 = local_1700;
        local_163c = local_1640;
        local_1638 = local_1640;
        local_1634 = local_1640;
        local_1630 = local_1640;
        local_162c = local_1640;
        local_1628 = local_1640;
        local_1624 = local_1640;
        local_1260 = local_ba0._0_8_;
        uStack_1258 = local_ba0._8_8_;
        uStack_1250 = local_bb0._0_8_;
        uStack_1248 = local_bb0._8_8_;
        local_1080 = local_10a0;
        uStack_1078 = uStack_1098;
        uStack_1070 = uStack_1090;
        uStack_1068 = uStack_1088;
        local_1000 = local_1ea0;
        uStack_ff8 = uStack_1e98;
        uStack_ff0 = uStack_1e90;
        uStack_fe8 = uStack_1e88;
        local_fc0 = uVar7;
        uStack_fb8 = uVar8;
        uStack_fb0 = uVar9;
        uStack_fa8 = uVar10;
      }
    }
  }
  else if (local_2244 == 4) {
    local_2244 = 4;
    for (local_22e4 = 0; local_22e4 < local_223c; local_22e4 = local_22e4 + 1) {
      this_00 = &local_2338;
      ncnn::Mat::channel(in_stack_ffffffffffffdbf0,(int)((ulong)this_00 >> 0x20));
      in_stack_ffffffffffffdbf0 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
      ncnn::Mat::~Mat((Mat *)0x50a15b);
      local_22f0 = in_stack_ffffffffffffdbf0;
      for (local_233c = 0; local_233c < local_2240; local_233c = local_233c + 1) {
        local_20f8 = local_22f0;
        local_2350 = local_22f0->data;
        piStack_2348 = local_22f0->refcount;
        auVar46._0_8_ = local_22f0->data;
        auVar46._8_8_ = local_22f0->refcount;
        local_20b8 = local_22f0;
        local_9f4 = 0x3f800000;
        local_a10 = 0x3f800000;
        local_2090 = 0x3f8000003f800000;
        uStack_2088 = 0x3f8000003f800000;
        local_9c0._8_8_ = 0x3f8000003f800000;
        local_9c0._0_8_ = 0x3f8000003f800000;
        local_4a0 = ZEXT816(0) << 0x20;
        local_4e0 = 0;
        local_490._8_8_ = SUB168(ZEXT816(0),4);
        uStack_4d8 = local_490._8_8_;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = local_490._8_8_;
        auVar2 = vsubps_avx(auVar47 << 0x40,auVar46);
        local_910 = 0x3f8000003f800000;
        uStack_908 = 0x3f8000003f800000;
        local_8d0._0_8_ = auVar2._0_8_;
        local_440 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar2._8_8_;
        uStack_438 = local_8d0._8_8_;
        local_450 = 0x42b0c0a542b0c0a5;
        uStack_448 = 0x42b0c0a542b0c0a5;
        auVar37._8_8_ = 0x42b0c0a542b0c0a5;
        auVar37._0_8_ = 0x42b0c0a542b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar37);
        local_8d0._0_8_ = auVar2._0_8_;
        local_400 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar2._8_8_;
        uStack_3f8 = local_8d0._8_8_;
        local_410 = 0xc2b0c0a5c2b0c0a5;
        uStack_408 = 0xc2b0c0a5c2b0c0a5;
        auVar39._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar39._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar39);
        local_8d0._0_8_ = auVar3._0_8_;
        uVar7 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar3._8_8_;
        uVar8 = local_8d0._8_8_;
        local_150 = 0x3fb8aa3b3fb8aa3b;
        uStack_148 = 0x3fb8aa3b3fb8aa3b;
        local_140._0_4_ = auVar3._0_4_;
        local_140._4_4_ = auVar3._4_4_;
        uStack_138._0_4_ = auVar3._8_4_;
        uStack_138._4_4_ = auVar3._12_4_;
        local_8f0._4_4_ = local_140._4_4_ * 1.442695;
        local_8f0._0_4_ = (float)local_140 * 1.442695;
        uStack_8e8._0_4_ = (float)uStack_138 * 1.442695;
        uStack_8e8._4_4_ = uStack_138._4_4_ * 1.442695;
        local_790 = local_8f0;
        uStack_788 = uStack_8e8;
        local_840 = 0x3f0000003f000000;
        uStack_838 = 0x3f0000003f000000;
        local_8f0._0_4_ = (float)local_140 * 1.442695 + 0.5;
        local_8f0._4_4_ = local_140._4_4_ * 1.442695 + 0.5;
        fVar52 = (float)uStack_138 * 1.442695 + 0.5;
        fVar53 = uStack_138._4_4_ * 1.442695 + 0.5;
        uStack_8e8._0_4_ = fVar52;
        uStack_8e8._4_4_ = fVar53;
        local_100 = local_8f0;
        uStack_f8 = uStack_8e8;
        local_900._4_4_ = (int)(float)local_8f0._4_4_;
        local_900._0_4_ = (int)(float)local_8f0._0_4_;
        local_900._8_4_ = (int)fVar52;
        local_900._12_4_ = (int)fVar53;
        local_e0 = local_900._0_8_;
        uStack_d8 = local_900._8_8_;
        auVar41._8_8_ = local_900._8_8_;
        auVar41._0_8_ = local_900._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar41);
        local_8e0 = auVar1._0_8_;
        local_a0 = local_8e0;
        uStack_8d8 = auVar1._8_8_;
        uStack_98 = uStack_8d8;
        local_b0 = local_8f0;
        uStack_a8 = uStack_8e8;
        auVar43._8_8_ = uStack_8e8;
        auVar43._0_8_ = local_8f0;
        auVar2 = vcmpps_avx(auVar43,auVar1,1);
        local_920._0_8_ = auVar2._0_8_;
        local_60 = local_920._0_8_;
        local_920._8_8_ = auVar2._8_8_;
        uStack_58 = local_920._8_8_;
        local_70 = 0x3f8000003f800000;
        uStack_68 = 0x3f8000003f800000;
        auVar45._8_8_ = 0x3f8000003f800000;
        auVar45._0_8_ = 0x3f8000003f800000;
        local_920 = vpand_avx(auVar2,auVar45);
        local_500 = local_8e0;
        uStack_4f8 = uStack_8d8;
        local_510 = local_920._0_8_;
        uStack_508 = local_920._8_8_;
        _local_8f0 = vsubps_avx(auVar1,local_920);
        local_170 = 0x3f3180003f318000;
        uStack_168 = 0x3f3180003f318000;
        local_160._0_4_ = local_8f0._0_4_;
        local_160._4_4_ = local_8f0._4_4_;
        uStack_158._0_4_ = local_8f0._8_4_;
        uStack_158._4_4_ = local_8f0._12_4_;
        local_8e0 = CONCAT44(local_160._4_4_ * 0.6933594,(float)local_160 * 0.6933594);
        uStack_8d8._0_4_ = (float)uStack_158 * 0.6933594;
        uStack_8d8._4_4_ = uStack_158._4_4_ * 0.6933594;
        local_180 = local_8f0;
        uStack_178 = uStack_8e8;
        local_190 = 0xb95e8083b95e8083;
        uStack_188 = 0xb95e8083b95e8083;
        local_520 = local_8d0._0_8_;
        uStack_518 = local_8d0._8_8_;
        local_530 = local_8e0;
        uStack_528 = uStack_8d8;
        auVar35._8_8_ = uStack_8d8;
        auVar35._0_8_ = local_8e0;
        auVar2 = vsubps_avx(auVar3,auVar35);
        local_8d0._0_8_ = auVar2._0_8_;
        local_540 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar2._8_8_;
        uStack_538 = local_8d0._8_8_;
        local_550 = CONCAT44(local_160._4_4_ * -0.00021219444,(float)local_160 * -0.00021219444);
        uStack_548 = CONCAT44(uStack_158._4_4_ * -0.00021219444,(float)uStack_158 * -0.00021219444);
        auVar34._8_8_ = uStack_548;
        auVar34._0_8_ = local_550;
        local_8d0 = vsubps_avx(auVar2,auVar34);
        local_1b0 = local_8d0._0_8_;
        uStack_1a8 = local_8d0._8_8_;
        local_1a0._0_4_ = local_8d0._0_4_;
        local_1a0._4_4_ = local_8d0._4_4_;
        uStack_198._0_4_ = local_8d0._8_4_;
        uStack_198._4_4_ = local_8d0._12_4_;
        local_930 = (float)local_1a0 * (float)local_1a0;
        fStack_92c = local_1a0._4_4_ * local_1a0._4_4_;
        fStack_928 = (float)uStack_198 * (float)uStack_198;
        fStack_924 = uStack_198._4_4_ * uStack_198._4_4_;
        local_1c0 = 0x3950696739506967;
        uStack_1b8 = 0x3950696739506967;
        local_1d0 = local_8d0._0_8_;
        uStack_1c8 = local_8d0._8_8_;
        local_7b0 = CONCAT44(local_1a0._4_4_ * 0.00019875691,(float)local_1a0 * 0.00019875691);
        uStack_7a8 = CONCAT44(uStack_198._4_4_ * 0.00019875691,(float)uStack_198 * 0.00019875691);
        local_7c0 = 0x3ab743ce3ab743ce;
        uStack_7b8 = 0x3ab743ce3ab743ce;
        local_940 = (float)local_1a0 * 0.00019875691 + 0.0013981999;
        fStack_93c = local_1a0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_938 = (float)uStack_198 * 0.00019875691 + 0.0013981999;
        fStack_934 = uStack_198._4_4_ * 0.00019875691 + 0.0013981999;
        local_1e0 = CONCAT44(fStack_93c,local_940);
        uStack_1d8 = CONCAT44(fStack_934,fStack_938);
        local_1f0 = local_8d0._0_8_;
        uStack_1e8 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_1a0;
        fStack_93c = fStack_93c * local_1a0._4_4_;
        fStack_938 = fStack_938 * (float)uStack_198;
        fStack_934 = fStack_934 * uStack_198._4_4_;
        local_7d0 = CONCAT44(fStack_93c,local_940);
        uStack_7c8 = CONCAT44(fStack_934,fStack_938);
        local_7e0 = 0x3c0889083c088908;
        uStack_7d8 = 0x3c0889083c088908;
        local_940 = local_940 + 0.008333452;
        fStack_93c = fStack_93c + 0.008333452;
        fStack_938 = fStack_938 + 0.008333452;
        fStack_934 = fStack_934 + 0.008333452;
        local_200 = CONCAT44(fStack_93c,local_940);
        uStack_1f8 = CONCAT44(fStack_934,fStack_938);
        local_210 = local_8d0._0_8_;
        uStack_208 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_1a0;
        fStack_93c = fStack_93c * local_1a0._4_4_;
        fStack_938 = fStack_938 * (float)uStack_198;
        fStack_934 = fStack_934 * uStack_198._4_4_;
        local_7f0 = CONCAT44(fStack_93c,local_940);
        uStack_7e8 = CONCAT44(fStack_934,fStack_938);
        local_800 = 0x3d2aa9c13d2aa9c1;
        uStack_7f8 = 0x3d2aa9c13d2aa9c1;
        local_940 = local_940 + 0.041665796;
        fStack_93c = fStack_93c + 0.041665796;
        fStack_938 = fStack_938 + 0.041665796;
        fStack_934 = fStack_934 + 0.041665796;
        local_220 = CONCAT44(fStack_93c,local_940);
        uStack_218 = CONCAT44(fStack_934,fStack_938);
        local_230 = local_8d0._0_8_;
        uStack_228 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_1a0;
        fStack_93c = fStack_93c * local_1a0._4_4_;
        fStack_938 = fStack_938 * (float)uStack_198;
        fStack_934 = fStack_934 * uStack_198._4_4_;
        local_810 = CONCAT44(fStack_93c,local_940);
        uStack_808 = CONCAT44(fStack_934,fStack_938);
        local_820 = 0x3e2aaaaa3e2aaaaa;
        uStack_818 = 0x3e2aaaaa3e2aaaaa;
        local_940 = local_940 + 0.16666666;
        fStack_93c = fStack_93c + 0.16666666;
        fStack_938 = fStack_938 + 0.16666666;
        fStack_934 = fStack_934 + 0.16666666;
        local_240 = CONCAT44(fStack_93c,local_940);
        uStack_238 = CONCAT44(fStack_934,fStack_938);
        local_250 = local_8d0._0_8_;
        uStack_248 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_1a0;
        fStack_93c = fStack_93c * local_1a0._4_4_;
        fStack_938 = fStack_938 * (float)uStack_198;
        fStack_934 = fStack_934 * uStack_198._4_4_;
        local_830 = CONCAT44(fStack_93c,local_940);
        uStack_828 = CONCAT44(fStack_934,fStack_938);
        local_940 = local_940 + 0.5;
        fStack_93c = fStack_93c + 0.5;
        fStack_938 = fStack_938 + 0.5;
        fStack_934 = fStack_934 + 0.5;
        local_260 = CONCAT44(fStack_93c,local_940);
        uStack_258 = CONCAT44(fStack_934,fStack_938);
        local_270 = CONCAT44(fStack_92c,local_930);
        uStack_268 = CONCAT44(fStack_924,fStack_928);
        local_940 = local_940 * local_930;
        fStack_93c = fStack_93c * fStack_92c;
        fStack_938 = fStack_938 * fStack_928;
        fStack_934 = fStack_934 * fStack_924;
        local_850 = CONCAT44(fStack_93c,local_940);
        uStack_848 = CONCAT44(fStack_934,fStack_938);
        local_860 = local_8d0._0_8_;
        uStack_858 = local_8d0._8_8_;
        local_940 = local_940 + (float)local_1a0;
        fStack_93c = fStack_93c + local_1a0._4_4_;
        fStack_938 = fStack_938 + (float)uStack_198;
        fStack_934 = fStack_934 + uStack_198._4_4_;
        local_870 = CONCAT44(fStack_93c,local_940);
        uStack_868 = CONCAT44(fStack_934,fStack_938);
        local_880 = 0x3f8000003f800000;
        uStack_878 = 0x3f8000003f800000;
        local_940 = local_940 + 1.0;
        fStack_93c = fStack_93c + 1.0;
        fStack_938 = fStack_938 + 1.0;
        fStack_934 = fStack_934 + 1.0;
        local_110 = local_8f0;
        uStack_108 = uStack_8e8;
        local_900._4_4_ = (int)local_160._4_4_;
        local_900._0_4_ = (int)(float)local_160;
        local_900._8_4_ = (int)(float)uStack_158;
        local_900._12_4_ = (int)uStack_158._4_4_;
        local_8b0 = local_900._0_8_;
        uStack_8a8 = local_900._8_8_;
        local_8c0 = 0x7f0000007f;
        uStack_8b8 = 0x7f0000007f;
        auVar29._8_8_ = local_900._8_8_;
        auVar29._0_8_ = local_900._0_8_;
        auVar28._8_8_ = 0x7f0000007f;
        auVar28._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar29,auVar28);
        local_900._0_8_ = auVar2._0_8_;
        local_890 = local_900._0_8_;
        local_900._8_8_ = auVar2._8_8_;
        uStack_888 = local_900._8_8_;
        local_894 = 0x17;
        local_900 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_40 = local_900._0_8_;
        uStack_38 = local_900._8_8_;
        local_950 = local_900._0_8_;
        uStack_948 = local_900._8_8_;
        local_280._4_4_ = fStack_93c;
        local_280._0_4_ = local_940;
        local_280._8_4_ = fStack_938;
        local_280._12_4_ = fStack_934;
        local_290._0_4_ = local_900._0_4_;
        local_290._4_4_ = local_900._4_4_;
        uStack_288._0_4_ = local_900._8_4_;
        uStack_288._4_4_ = local_900._12_4_;
        local_940 = local_940 * (float)local_290;
        fStack_93c = fStack_93c * local_290._4_4_;
        fStack_938 = fStack_938 * (float)uStack_288;
        fStack_934 = fStack_934 * uStack_288._4_4_;
        local_990 = CONCAT44(fStack_93c,local_940);
        uStack_988 = CONCAT44(fStack_934,fStack_938);
        local_9d0 = local_940 + 1.0;
        fStack_9cc = fStack_93c + 1.0;
        fStack_9c8 = fStack_938 + 1.0;
        fStack_9c4 = fStack_934 + 1.0;
        auVar26._4_4_ = fStack_9cc;
        auVar26._0_4_ = local_9d0;
        auVar26._8_4_ = fStack_9c8;
        auVar26._12_4_ = fStack_9c4;
        local_20d0 = vdivps_avx(local_9c0,auVar26);
        local_20f8->data = (void *)local_20d0._0_8_;
        local_20f8->refcount = (int *)local_20d0._8_8_;
        local_22f0 = (Mat *)&local_22f0->elemsize;
        local_2080 = local_2350;
        piStack_2078 = piStack_2348;
        uStack_a0c = local_a10;
        uStack_a08 = local_a10;
        uStack_a04 = local_a10;
        local_980 = local_9c0;
        local_7a0 = local_840;
        uStack_798 = uStack_838;
        local_4f0 = local_2350;
        piStack_4e8 = piStack_2348;
        local_490 = local_4a0;
        local_290 = local_900._0_8_;
        uStack_288 = local_900._8_8_;
        local_1a0 = local_1b0;
        uStack_198 = uStack_1a8;
        local_160 = local_8f0;
        uStack_158 = uStack_8e8;
        local_140 = uVar7;
        uStack_138 = uVar8;
      }
    }
  }
  else {
    for (local_2354 = 0; local_2354 < local_223c; local_2354 = local_2354 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffdbf0,(int)((ulong)in_stack_ffffffffffffdbe8 >> 0x20));
      pauVar50 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_23a8);
      ncnn::Mat::~Mat((Mat *)0x50ab9f);
      local_2360 = pauVar50;
      for (local_23ac = 0; local_23ac + 7 < local_2240; local_23ac = local_23ac + 8) {
        local_2210 = local_2360;
        local_2160 = *(undefined8 *)*local_2360;
        uStack_2158 = *(undefined8 *)(*local_2360 + 8);
        uStack_2150 = *(undefined8 *)(*local_2360 + 0x10);
        uStack_2148 = *(undefined8 *)(*local_2360 + 0x18);
        local_21c8 = local_2360;
        local_2064 = 0x3f800000;
        local_1680 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_16a0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_1690 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_2180 = local_16a0._0_8_;
        uStack_2178 = local_16a0._8_8_;
        uStack_2170 = auStack_1690._0_8_;
        uStack_2168 = auStack_1690._8_8_;
        local_2000._16_8_ = auStack_1690._0_8_;
        local_2000._0_16_ = local_16a0;
        local_2000._24_8_ = auStack_1690._8_8_;
        local_1720 = ZEXT832(0) << 0x20;
        local_1740 = 0;
        local_16c0._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1738 = local_16c0._8_8_;
        uStack_1730 = 0;
        uStack_1728 = 0;
        auVar6 = vsubps_avx(ZEXT832((ulong)local_16c0._8_8_) << 0x40,*local_2360);
        local_1bc0 = 0x3f8000003f800000;
        uStack_1bb8 = 0x3f8000003f800000;
        uStack_1bb0 = 0x3f8000003f800000;
        uStack_1ba8 = 0x3f8000003f800000;
        local_1b40._0_8_ = auVar6._0_8_;
        local_1600 = local_1b40._0_8_;
        local_1b40._8_8_ = auVar6._8_8_;
        uStack_15f8 = local_1b40._8_8_;
        local_1b40._16_8_ = auVar6._16_8_;
        uStack_15f0 = local_1b40._16_8_;
        local_1b40._24_8_ = auVar6._24_8_;
        uStack_15e8 = local_1b40._24_8_;
        local_1620 = 0x42b0c0a542b0c0a5;
        uStack_1618 = 0x42b0c0a542b0c0a5;
        uStack_1610 = 0x42b0c0a542b0c0a5;
        uStack_1608 = 0x42b0c0a542b0c0a5;
        auVar15._8_8_ = 0x42b0c0a542b0c0a5;
        auVar15._0_8_ = 0x42b0c0a542b0c0a5;
        auVar15._16_8_ = 0x42b0c0a542b0c0a5;
        auVar15._24_8_ = 0x42b0c0a542b0c0a5;
        auVar6 = vminps_avx(auVar6,auVar15);
        local_1b40._0_8_ = auVar6._0_8_;
        local_1580 = local_1b40._0_8_;
        local_1b40._8_8_ = auVar6._8_8_;
        uStack_1578 = local_1b40._8_8_;
        local_1b40._16_8_ = auVar6._16_8_;
        uStack_1570 = local_1b40._16_8_;
        local_1b40._24_8_ = auVar6._24_8_;
        uStack_1568 = local_1b40._24_8_;
        local_15a0 = 0xc2b0c0a5c2b0c0a5;
        uStack_1598 = 0xc2b0c0a5c2b0c0a5;
        uStack_1590 = 0xc2b0c0a5c2b0c0a5;
        uStack_1588 = 0xc2b0c0a5c2b0c0a5;
        auVar17._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar17._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar17._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar17._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar6,auVar17);
        local_1b40._0_8_ = auVar4._0_8_;
        uVar7 = local_1b40._0_8_;
        local_1b40._8_8_ = auVar4._8_8_;
        uVar8 = local_1b40._8_8_;
        local_1b40._16_8_ = auVar4._16_8_;
        uVar9 = local_1b40._16_8_;
        local_1b40._24_8_ = auVar4._24_8_;
        uVar10 = local_1b40._24_8_;
        local_12a0 = 0x3fb8aa3b3fb8aa3b;
        uStack_1298 = 0x3fb8aa3b3fb8aa3b;
        uStack_1290 = 0x3fb8aa3b3fb8aa3b;
        uStack_1288 = 0x3fb8aa3b3fb8aa3b;
        local_1280._0_4_ = auVar4._0_4_;
        local_1280._4_4_ = auVar4._4_4_;
        uStack_1278._0_4_ = auVar4._8_4_;
        uStack_1278._4_4_ = auVar4._12_4_;
        uStack_1270._0_4_ = auVar4._16_4_;
        uStack_1270._4_4_ = auVar4._20_4_;
        uStack_1268._0_4_ = auVar4._24_4_;
        uStack_1268._4_4_ = auVar4._28_4_;
        local_1b80._4_4_ = local_1280._4_4_ * 1.442695;
        local_1b80._0_4_ = (float)local_1280 * 1.442695;
        uStack_1b78._0_4_ = (float)uStack_1278 * 1.442695;
        uStack_1b78._4_4_ = uStack_1278._4_4_ * 1.442695;
        uStack_1b70._0_4_ = (float)uStack_1270 * 1.442695;
        uStack_1b70._4_4_ = uStack_1270._4_4_ * 1.442695;
        auVar49 = _local_1b80;
        uStack_1b68._0_4_ = (float)uStack_1268 * 1.442695;
        uStack_1b68._4_4_ = uStack_1268._4_4_;
        auVar6 = _local_1b80;
        local_1940 = local_1b80;
        uStack_1938 = uStack_1b78;
        uStack_1b70 = auVar49._16_8_;
        uStack_1930 = uStack_1b70;
        uStack_1b68 = auVar6._24_8_;
        uStack_1928 = uStack_1b68;
        local_1aa0 = 0x3f0000003f000000;
        uStack_1a98 = 0x3f0000003f000000;
        uStack_1a90 = 0x3f0000003f000000;
        uStack_1a88 = 0x3f0000003f000000;
        local_1b80._4_4_ = local_1280._4_4_ * 1.442695 + 0.5;
        local_1b80._0_4_ = (float)local_1280 * 1.442695 + 0.5;
        uStack_1b78._0_4_ = (float)uStack_1278 * 1.442695 + 0.5;
        uStack_1b78._4_4_ = uStack_1278._4_4_ * 1.442695 + 0.5;
        uStack_1b70._0_4_ = (float)uStack_1270 * 1.442695 + 0.5;
        uStack_1b70._4_4_ = uStack_1270._4_4_ * 1.442695 + 0.5;
        uStack_1b68._0_4_ = (float)uStack_1268 * 1.442695 + 0.5;
        uStack_1b68._4_4_ = uStack_1268._4_4_ + 0.5;
        auVar5 = vroundps_avx(_local_1b80,1);
        auVar6 = vcmpps_avx(_local_1b80,auVar5,1);
        local_1be0._0_8_ = auVar6._0_8_;
        local_f80 = local_1be0._0_8_;
        local_1be0._8_8_ = auVar6._8_8_;
        uStack_f78 = local_1be0._8_8_;
        local_1be0._16_8_ = auVar6._16_8_;
        uStack_f70 = local_1be0._16_8_;
        local_1be0._24_8_ = auVar6._24_8_;
        uStack_f68 = local_1be0._24_8_;
        local_fa0 = 0x3f8000003f800000;
        uStack_f98 = 0x3f8000003f800000;
        uStack_f90 = 0x3f8000003f800000;
        uStack_f88 = 0x3f8000003f800000;
        auVar19._8_8_ = 0x3f8000003f800000;
        auVar19._0_8_ = 0x3f8000003f800000;
        auVar19._16_8_ = 0x3f8000003f800000;
        auVar19._24_8_ = 0x3f8000003f800000;
        local_1be0 = vandps_avx(auVar6,auVar19);
        local_1b60 = auVar5._0_8_;
        local_1880 = local_1b60;
        uStack_1b58 = auVar5._8_8_;
        uStack_1878 = uStack_1b58;
        uStack_1b50 = auVar5._16_8_;
        uStack_1870 = uStack_1b50;
        uStack_1b48 = auVar5._24_8_;
        uStack_1868 = uStack_1b48;
        local_18a0 = local_1be0._0_8_;
        uStack_1898 = local_1be0._8_8_;
        uStack_1890 = local_1be0._16_8_;
        uStack_1888 = local_1be0._24_8_;
        _local_1b80 = vsubps_avx(auVar5,local_1be0);
        local_12e0 = 0x3f3180003f318000;
        uStack_12d8 = 0x3f3180003f318000;
        uStack_12d0 = 0x3f3180003f318000;
        uStack_12c8 = 0x3f3180003f318000;
        local_12c0._0_4_ = local_1b80._0_4_;
        local_12c0._4_4_ = local_1b80._4_4_;
        uStack_12b8._0_4_ = local_1b80._8_4_;
        uStack_12b8._4_4_ = local_1b80._12_4_;
        uStack_12b0._0_4_ = local_1b80._16_4_;
        uStack_12b0._4_4_ = local_1b80._20_4_;
        uStack_12a8._0_4_ = local_1b80._24_4_;
        uStack_12a8._4_4_ = local_1b80._28_4_;
        local_1b60._4_4_ = local_12c0._4_4_ * 0.6933594;
        local_1b60._0_4_ = (float)local_12c0 * 0.6933594;
        uStack_1b58._0_4_ = (float)uStack_12b8 * 0.6933594;
        uStack_1b58._4_4_ = uStack_12b8._4_4_ * 0.6933594;
        uStack_1b50._0_4_ = (float)uStack_12b0 * 0.6933594;
        uStack_1b50._4_4_ = uStack_12b0._4_4_ * 0.6933594;
        auVar49 = _local_1b60;
        uStack_1b48._0_4_ = (float)uStack_12a8 * 0.6933594;
        uStack_1b48._4_4_ = uStack_12a8._4_4_;
        auVar15 = _local_1b60;
        local_1300 = local_1b80;
        uStack_12f8 = uStack_1b78;
        uStack_12f0 = uStack_1b70;
        uStack_12e8 = uStack_1b68;
        local_1320 = 0xb95e8083b95e8083;
        uStack_1318 = 0xb95e8083b95e8083;
        uStack_1310 = 0xb95e8083b95e8083;
        uStack_1308 = 0xb95e8083b95e8083;
        local_18c0 = local_1b40._0_8_;
        uStack_18b8 = local_1b40._8_8_;
        uStack_18b0 = local_1b40._16_8_;
        uStack_18a8 = local_1b40._24_8_;
        local_18e0 = local_1b60;
        uStack_18d8 = uStack_1b58;
        uStack_1b50 = auVar49._16_8_;
        uStack_18d0 = uStack_1b50;
        uStack_1b48 = auVar15._24_8_;
        uStack_18c8 = uStack_1b48;
        auVar5._16_8_ = uStack_1b50;
        auVar5._0_16_ = _local_1b60;
        auVar5._24_8_ = uStack_1b48;
        auVar6 = vsubps_avx(auVar4,auVar5);
        local_1b40._0_8_ = auVar6._0_8_;
        local_1900 = local_1b40._0_8_;
        local_1b40._8_8_ = auVar6._8_8_;
        uStack_18f8 = local_1b40._8_8_;
        local_1b40._16_8_ = auVar6._16_8_;
        uStack_18f0 = local_1b40._16_8_;
        local_1b40._24_8_ = auVar6._24_8_;
        uStack_18e8 = local_1b40._24_8_;
        local_1920 = CONCAT44(local_12c0._4_4_ * -0.00021219444,(float)local_12c0 * -0.00021219444);
        uStack_1918 = CONCAT44(uStack_12b8._4_4_ * -0.00021219444,
                               (float)uStack_12b8 * -0.00021219444);
        uStack_1910 = CONCAT44(uStack_12b0._4_4_ * -0.00021219444,
                               (float)uStack_12b0 * -0.00021219444);
        uStack_1908 = CONCAT44(uStack_12a8._4_4_,(float)uStack_12a8 * -0.00021219444);
        auVar4._8_8_ = uStack_1918;
        auVar4._0_8_ = local_1920;
        auVar4._16_8_ = uStack_1910;
        auVar4._24_8_ = uStack_1908;
        local_1b40 = vsubps_avx(auVar6,auVar4);
        local_1360 = local_1b40._0_8_;
        uStack_1358 = local_1b40._8_8_;
        uStack_1350 = local_1b40._16_8_;
        uStack_1348 = local_1b40._24_8_;
        local_1340._0_4_ = local_1b40._0_4_;
        local_1340._4_4_ = local_1b40._4_4_;
        uStack_1338._0_4_ = local_1b40._8_4_;
        uStack_1338._4_4_ = local_1b40._12_4_;
        uStack_1330._0_4_ = local_1b40._16_4_;
        uStack_1330._4_4_ = local_1b40._20_4_;
        uStack_1328._0_4_ = local_1b40._24_4_;
        uStack_1328._4_4_ = local_1b40._28_4_;
        fStack_1be4 = uStack_1328._4_4_;
        local_1c00 = (float)local_1340 * (float)local_1340;
        fStack_1bfc = local_1340._4_4_ * local_1340._4_4_;
        fStack_1bf8 = (float)uStack_1338 * (float)uStack_1338;
        fStack_1bf4 = uStack_1338._4_4_ * uStack_1338._4_4_;
        fStack_1bf0 = (float)uStack_1330 * (float)uStack_1330;
        fStack_1bec = uStack_1330._4_4_ * uStack_1330._4_4_;
        fStack_1be8 = (float)uStack_1328 * (float)uStack_1328;
        local_1380 = 0x3950696739506967;
        uStack_1378 = 0x3950696739506967;
        uStack_1370 = 0x3950696739506967;
        uStack_1368 = 0x3950696739506967;
        local_13a0 = local_1b40._0_8_;
        uStack_1398 = local_1b40._8_8_;
        uStack_1390 = local_1b40._16_8_;
        uStack_1388 = local_1b40._24_8_;
        local_1980 = CONCAT44(local_1340._4_4_ * 0.00019875691,(float)local_1340 * 0.00019875691);
        uStack_1978 = CONCAT44(uStack_1338._4_4_ * 0.00019875691,(float)uStack_1338 * 0.00019875691)
        ;
        uStack_1970 = CONCAT44(uStack_1330._4_4_ * 0.00019875691,(float)uStack_1330 * 0.00019875691)
        ;
        uStack_1968 = CONCAT44(0x39506967,(float)uStack_1328 * 0.00019875691);
        local_19a0 = 0x3ab743ce3ab743ce;
        uStack_1998 = 0x3ab743ce3ab743ce;
        uStack_1990 = 0x3ab743ce3ab743ce;
        uStack_1988 = 0x3ab743ce3ab743ce;
        local_1c20 = (float)local_1340 * 0.00019875691 + 0.0013981999;
        fStack_1c1c = local_1340._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1c18 = (float)uStack_1338 * 0.00019875691 + 0.0013981999;
        fStack_1c14 = uStack_1338._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1c10 = (float)uStack_1330 * 0.00019875691 + 0.0013981999;
        fStack_1c0c = uStack_1330._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1c08 = (float)uStack_1328 * 0.00019875691 + 0.0013981999;
        local_13c0 = CONCAT44(fStack_1c1c,local_1c20);
        uStack_13b8 = CONCAT44(fStack_1c14,fStack_1c18);
        uStack_13b0 = CONCAT44(fStack_1c0c,fStack_1c10);
        uStack_13a8 = CONCAT44(0x3ad150fb,fStack_1c08);
        local_13e0 = local_1b40._0_8_;
        uStack_13d8 = local_1b40._8_8_;
        uStack_13d0 = local_1b40._16_8_;
        uStack_13c8 = local_1b40._24_8_;
        local_1c20 = local_1c20 * (float)local_1340;
        fStack_1c1c = fStack_1c1c * local_1340._4_4_;
        fStack_1c18 = fStack_1c18 * (float)uStack_1338;
        fStack_1c14 = fStack_1c14 * uStack_1338._4_4_;
        fStack_1c10 = fStack_1c10 * (float)uStack_1330;
        fStack_1c0c = fStack_1c0c * uStack_1330._4_4_;
        fStack_1c08 = fStack_1c08 * (float)uStack_1328;
        local_19c0 = CONCAT44(fStack_1c1c,local_1c20);
        uStack_19b8 = CONCAT44(fStack_1c14,fStack_1c18);
        uStack_19b0 = CONCAT44(fStack_1c0c,fStack_1c10);
        uStack_19a8 = CONCAT44(0x3ad150fb,fStack_1c08);
        local_19e0 = 0x3c0889083c088908;
        uStack_19d8 = 0x3c0889083c088908;
        uStack_19d0 = 0x3c0889083c088908;
        uStack_19c8 = 0x3c0889083c088908;
        local_1c20 = local_1c20 + 0.008333452;
        fStack_1c1c = fStack_1c1c + 0.008333452;
        fStack_1c18 = fStack_1c18 + 0.008333452;
        fStack_1c14 = fStack_1c14 + 0.008333452;
        fStack_1c10 = fStack_1c10 + 0.008333452;
        fStack_1c0c = fStack_1c0c + 0.008333452;
        fStack_1c08 = fStack_1c08 + 0.008333452;
        local_1400 = CONCAT44(fStack_1c1c,local_1c20);
        uStack_13f8 = CONCAT44(fStack_1c14,fStack_1c18);
        uStack_13f0 = CONCAT44(fStack_1c0c,fStack_1c10);
        uStack_13e8 = CONCAT44(0x3c22b327,fStack_1c08);
        local_1420 = local_1b40._0_8_;
        uStack_1418 = local_1b40._8_8_;
        uStack_1410 = local_1b40._16_8_;
        uStack_1408 = local_1b40._24_8_;
        local_1c20 = local_1c20 * (float)local_1340;
        fStack_1c1c = fStack_1c1c * local_1340._4_4_;
        fStack_1c18 = fStack_1c18 * (float)uStack_1338;
        fStack_1c14 = fStack_1c14 * uStack_1338._4_4_;
        fStack_1c10 = fStack_1c10 * (float)uStack_1330;
        fStack_1c0c = fStack_1c0c * uStack_1330._4_4_;
        fStack_1c08 = fStack_1c08 * (float)uStack_1328;
        local_1a00 = CONCAT44(fStack_1c1c,local_1c20);
        uStack_19f8 = CONCAT44(fStack_1c14,fStack_1c18);
        uStack_19f0 = CONCAT44(fStack_1c0c,fStack_1c10);
        uStack_19e8 = CONCAT44(0x3c22b327,fStack_1c08);
        local_1a20 = 0x3d2aa9c13d2aa9c1;
        uStack_1a18 = 0x3d2aa9c13d2aa9c1;
        uStack_1a10 = 0x3d2aa9c13d2aa9c1;
        uStack_1a08 = 0x3d2aa9c13d2aa9c1;
        local_1c20 = local_1c20 + 0.041665796;
        fStack_1c1c = fStack_1c1c + 0.041665796;
        fStack_1c18 = fStack_1c18 + 0.041665796;
        fStack_1c14 = fStack_1c14 + 0.041665796;
        fStack_1c10 = fStack_1c10 + 0.041665796;
        fStack_1c0c = fStack_1c0c + 0.041665796;
        fStack_1c08 = fStack_1c08 + 0.041665796;
        local_1440 = CONCAT44(fStack_1c1c,local_1c20);
        uStack_1438 = CONCAT44(fStack_1c14,fStack_1c18);
        uStack_1430 = CONCAT44(fStack_1c0c,fStack_1c10);
        uStack_1428 = CONCAT44(0x3d53568b,fStack_1c08);
        local_1460 = local_1b40._0_8_;
        uStack_1458 = local_1b40._8_8_;
        uStack_1450 = local_1b40._16_8_;
        uStack_1448 = local_1b40._24_8_;
        local_1c20 = local_1c20 * (float)local_1340;
        fStack_1c1c = fStack_1c1c * local_1340._4_4_;
        fStack_1c18 = fStack_1c18 * (float)uStack_1338;
        fStack_1c14 = fStack_1c14 * uStack_1338._4_4_;
        fStack_1c10 = fStack_1c10 * (float)uStack_1330;
        fStack_1c0c = fStack_1c0c * uStack_1330._4_4_;
        fStack_1c08 = fStack_1c08 * (float)uStack_1328;
        local_1a40 = CONCAT44(fStack_1c1c,local_1c20);
        uStack_1a38 = CONCAT44(fStack_1c14,fStack_1c18);
        uStack_1a30 = CONCAT44(fStack_1c0c,fStack_1c10);
        uStack_1a28 = CONCAT44(0x3d53568b,fStack_1c08);
        local_1a60 = 0x3e2aaaaa3e2aaaaa;
        uStack_1a58 = 0x3e2aaaaa3e2aaaaa;
        uStack_1a50 = 0x3e2aaaaa3e2aaaaa;
        uStack_1a48 = 0x3e2aaaaa3e2aaaaa;
        local_1c20 = local_1c20 + 0.16666666;
        fStack_1c1c = fStack_1c1c + 0.16666666;
        fStack_1c18 = fStack_1c18 + 0.16666666;
        fStack_1c14 = fStack_1c14 + 0.16666666;
        fStack_1c10 = fStack_1c10 + 0.16666666;
        fStack_1c0c = fStack_1c0c + 0.16666666;
        fStack_1c08 = fStack_1c08 + 0.16666666;
        local_1480 = CONCAT44(fStack_1c1c,local_1c20);
        uStack_1478 = CONCAT44(fStack_1c14,fStack_1c18);
        uStack_1470 = CONCAT44(fStack_1c0c,fStack_1c10);
        uStack_1468 = CONCAT44(0x3e5f804d,fStack_1c08);
        local_14a0 = local_1b40._0_8_;
        uStack_1498 = local_1b40._8_8_;
        uStack_1490 = local_1b40._16_8_;
        uStack_1488 = local_1b40._24_8_;
        local_1c20 = local_1c20 * (float)local_1340;
        fStack_1c1c = fStack_1c1c * local_1340._4_4_;
        fStack_1c18 = fStack_1c18 * (float)uStack_1338;
        fStack_1c14 = fStack_1c14 * uStack_1338._4_4_;
        fStack_1c10 = fStack_1c10 * (float)uStack_1330;
        fStack_1c0c = fStack_1c0c * uStack_1330._4_4_;
        fStack_1c08 = fStack_1c08 * (float)uStack_1328;
        local_1a80 = CONCAT44(fStack_1c1c,local_1c20);
        uStack_1a78 = CONCAT44(fStack_1c14,fStack_1c18);
        uStack_1a70 = CONCAT44(fStack_1c0c,fStack_1c10);
        uStack_1a68 = CONCAT44(0x3e5f804d,fStack_1c08);
        local_1c20 = local_1c20 + 0.5;
        fStack_1c1c = fStack_1c1c + 0.5;
        fStack_1c18 = fStack_1c18 + 0.5;
        fStack_1c14 = fStack_1c14 + 0.5;
        fStack_1c10 = fStack_1c10 + 0.5;
        fStack_1c0c = fStack_1c0c + 0.5;
        fStack_1c08 = fStack_1c08 + 0.5;
        local_14c0 = CONCAT44(fStack_1c1c,local_1c20);
        uStack_14b8 = CONCAT44(fStack_1c14,fStack_1c18);
        uStack_14b0 = CONCAT44(fStack_1c0c,fStack_1c10);
        uStack_14a8 = CONCAT44(0x3f37e013,fStack_1c08);
        local_14e0 = CONCAT44(fStack_1bfc,local_1c00);
        uStack_14d8 = CONCAT44(fStack_1bf4,fStack_1bf8);
        uStack_14d0 = CONCAT44(fStack_1bec,fStack_1bf0);
        uStack_14c8 = CONCAT44(uStack_1328._4_4_,fStack_1be8);
        local_1c20 = local_1c20 * local_1c00;
        fStack_1c1c = fStack_1c1c * fStack_1bfc;
        fStack_1c18 = fStack_1c18 * fStack_1bf8;
        fStack_1c14 = fStack_1c14 * fStack_1bf4;
        fStack_1c10 = fStack_1c10 * fStack_1bf0;
        fStack_1c0c = fStack_1c0c * fStack_1bec;
        fStack_1c08 = fStack_1c08 * fStack_1be8;
        local_1ac0 = CONCAT44(fStack_1c1c,local_1c20);
        uStack_1ab8 = CONCAT44(fStack_1c14,fStack_1c18);
        uStack_1ab0 = CONCAT44(fStack_1c0c,fStack_1c10);
        uStack_1aa8 = CONCAT44(0x3f37e013,fStack_1c08);
        local_1ae0 = local_1b40._0_8_;
        uStack_1ad8 = local_1b40._8_8_;
        uStack_1ad0 = local_1b40._16_8_;
        uStack_1ac8 = local_1b40._24_8_;
        local_1c20 = local_1c20 + (float)local_1340;
        fStack_1c1c = fStack_1c1c + local_1340._4_4_;
        fStack_1c18 = fStack_1c18 + (float)uStack_1338;
        fStack_1c14 = fStack_1c14 + uStack_1338._4_4_;
        fStack_1c10 = fStack_1c10 + (float)uStack_1330;
        fStack_1c0c = fStack_1c0c + uStack_1330._4_4_;
        fStack_1c08 = fStack_1c08 + (float)uStack_1328;
        local_1b00 = CONCAT44(fStack_1c1c,local_1c20);
        uStack_1af8 = CONCAT44(fStack_1c14,fStack_1c18);
        uStack_1af0 = CONCAT44(fStack_1c0c,fStack_1c10);
        uStack_1ae8 = CONCAT44(uStack_1328._4_4_ + 0.71826285,fStack_1c08);
        local_1b20 = 0x3f8000003f800000;
        uStack_1b18 = 0x3f8000003f800000;
        uStack_1b10 = 0x3f8000003f800000;
        uStack_1b08 = 0x3f8000003f800000;
        local_1c20 = local_1c20 + 1.0;
        fStack_1c1c = fStack_1c1c + 1.0;
        fStack_1c18 = fStack_1c18 + 1.0;
        fStack_1c14 = fStack_1c14 + 1.0;
        fStack_1c10 = fStack_1c10 + 1.0;
        fStack_1c0c = fStack_1c0c + 1.0;
        fStack_1c08 = fStack_1c08 + 1.0;
        fStack_1c04 = uStack_1328._4_4_ + 0.71826285 + 1.0;
        local_f20 = local_1b80;
        uStack_f18 = uStack_1b78;
        uStack_f10 = uStack_1b70;
        uStack_f08 = uStack_1b68;
        local_1ba0 = CONCAT44((int)local_12c0._4_4_,(int)(float)local_12c0);
        uStack_1b98 = CONCAT44((int)uStack_12b8._4_4_,(int)(float)uStack_12b8);
        uStack_1b90 = CONCAT44((int)uStack_12b0._4_4_,(int)(float)uStack_12b0);
        uStack_1b88 = CONCAT44((int)uStack_12a8._4_4_,(int)(float)uStack_12a8);
        local_e00 = local_1ba0;
        uStack_df8 = uStack_1b98;
        uStack_df0 = uStack_1b90;
        uStack_de8 = uStack_1b88;
        local_e20 = 0x7f0000007f;
        uStack_e18 = 0x7f0000007f;
        uStack_e10 = 0x7f0000007f;
        uStack_e08 = 0x7f0000007f;
        local_ea0 = local_1ba0;
        uStack_e98 = uStack_1b98;
        uStack_e90 = uStack_1b90;
        uStack_e88 = uStack_1b88;
        local_ec0 = 0x7f0000007f;
        uStack_eb8 = 0x7f0000007f;
        uStack_eb0 = 0x7f0000007f;
        uStack_ea8 = 0x7f0000007f;
        local_e50 = 0x7f0000007f;
        uStack_e48 = 0x7f0000007f;
        local_e60 = 0x7f0000007f;
        uStack_e58 = 0x7f0000007f;
        local_aa0 = local_1ba0;
        uStack_a98 = uStack_1b98;
        local_ab0 = 0x7f0000007f;
        uStack_aa8 = 0x7f0000007f;
        auVar25._8_8_ = uStack_1b98;
        auVar25._0_8_ = local_1ba0;
        auVar3._8_8_ = 0x7f0000007f;
        auVar3._0_8_ = 0x7f0000007f;
        local_e30 = vpaddd_avx(auVar25,auVar3);
        local_ac0 = uStack_1b90;
        uStack_ab8 = uStack_1b88;
        local_ad0 = 0x7f0000007f;
        uStack_ac8 = 0x7f0000007f;
        auVar1._8_8_ = uStack_1b88;
        auVar1._0_8_ = uStack_1b90;
        auVar2._8_8_ = 0x7f0000007f;
        auVar2._0_8_ = 0x7f0000007f;
        local_e40 = vpaddd_avx(auVar1,auVar2);
        local_ee0 = local_e30._0_8_;
        uStack_ed8 = local_e30._8_8_;
        uStack_ed0 = local_e40._0_8_;
        uStack_ec8 = local_e40._8_8_;
        local_e80 = local_e30._0_8_;
        uStack_e78 = local_e30._8_8_;
        uStack_e70 = local_e40._0_8_;
        uStack_e68 = local_e40._8_8_;
        local_c40 = local_e30._0_8_;
        uStack_c38 = local_e30._8_8_;
        uStack_c30 = local_e40._0_8_;
        uStack_c28 = local_e40._8_8_;
        local_c44 = 0x17;
        local_cc0 = local_e30._0_8_;
        uStack_cb8 = local_e30._8_8_;
        uStack_cb0 = local_e40._0_8_;
        uStack_ca8 = local_e40._8_8_;
        local_a20 = local_e30._0_8_;
        uStack_a18 = local_e30._8_8_;
        local_a24 = 0x17;
        local_c60 = vpslld_avx(local_e30,ZEXT416(0x17));
        local_a40 = local_e40._0_8_;
        uStack_a38 = local_e40._8_8_;
        local_a44 = 0x17;
        local_c70 = vpslld_avx(local_e40,ZEXT416(0x17));
        local_ce0 = local_c60._0_8_;
        uStack_cd8 = local_c60._8_8_;
        uStack_cd0 = local_c70._0_8_;
        uStack_cc8 = local_c70._8_8_;
        local_ca0 = local_c60._0_8_;
        uStack_c98 = local_c60._8_8_;
        uStack_c90 = local_c70._0_8_;
        uStack_c88 = local_c70._8_8_;
        local_1ba0 = local_c60._0_8_;
        uStack_1b98 = local_c60._8_8_;
        uStack_1b90 = local_c70._0_8_;
        uStack_1b88 = local_c70._8_8_;
        local_b60 = local_c60._0_8_;
        uStack_b58 = local_c60._8_8_;
        uStack_b50 = local_c70._0_8_;
        uStack_b48 = local_c70._8_8_;
        local_1c40 = local_c60._0_8_;
        uStack_1c38 = local_c60._8_8_;
        uStack_1c30 = local_c70._0_8_;
        uStack_1c28 = local_c70._8_8_;
        local_1500._4_4_ = fStack_1c1c;
        local_1500._0_4_ = local_1c20;
        local_1500._8_4_ = fStack_1c18;
        local_1500._12_4_ = fStack_1c14;
        local_1500._16_4_ = fStack_1c10;
        local_1500._20_4_ = fStack_1c0c;
        local_1500._24_4_ = fStack_1c08;
        local_1500._28_4_ = fStack_1c04;
        local_1520._0_4_ = local_c60._0_4_;
        local_1520._4_4_ = local_c60._4_4_;
        uStack_1518._0_4_ = local_c60._8_4_;
        uStack_1518._4_4_ = local_c60._12_4_;
        uStack_1510._0_4_ = local_c70._0_4_;
        uStack_1510._4_4_ = local_c70._4_4_;
        uStack_1508._0_4_ = local_c70._8_4_;
        local_1c20 = local_1c20 * (float)local_1520;
        fStack_1c1c = fStack_1c1c * local_1520._4_4_;
        fStack_1c18 = fStack_1c18 * (float)uStack_1518;
        fStack_1c14 = fStack_1c14 * uStack_1518._4_4_;
        fStack_1c10 = fStack_1c10 * (float)uStack_1510;
        fStack_1c0c = fStack_1c0c * uStack_1510._4_4_;
        fStack_1c08 = fStack_1c08 * (float)uStack_1508;
        local_1fa0 = CONCAT44(fStack_1c1c,local_1c20);
        uStack_1f98 = CONCAT44(fStack_1c14,fStack_1c18);
        uStack_1f90 = CONCAT44(fStack_1c0c,fStack_1c10);
        uStack_1f88 = CONCAT44(fStack_1c04,fStack_1c08);
        local_1f80._0_4_ = local_16a0._0_4_;
        local_1f80._4_4_ = local_16a0._4_4_;
        fStack_1f78 = local_16a0._8_4_;
        fStack_1f74 = local_16a0._12_4_;
        fStack_1f70 = auStack_1690._0_4_;
        fStack_1f6c = auStack_1690._4_4_;
        fStack_1f68 = auStack_1690._8_4_;
        fStack_1f64 = auStack_1690._12_4_;
        local_2020 = (float)local_1f80._0_4_ + local_1c20;
        fStack_201c = (float)local_1f80._4_4_ + fStack_1c1c;
        fStack_2018 = fStack_1f78 + fStack_1c18;
        fStack_2014 = fStack_1f74 + fStack_1c14;
        fStack_2010 = fStack_1f70 + fStack_1c10;
        fStack_200c = fStack_1f6c + fStack_1c0c;
        fStack_2008 = fStack_1f68 + fStack_1c08;
        fStack_2004 = fStack_1f64 + fStack_1c04;
        auVar6._4_4_ = fStack_201c;
        auVar6._0_4_ = local_2020;
        auVar6._8_4_ = fStack_2018;
        auVar6._12_4_ = fStack_2014;
        auVar6._16_4_ = fStack_2010;
        auVar6._20_4_ = fStack_200c;
        auVar6._24_4_ = fStack_2008;
        auVar6._28_4_ = fStack_2004;
        local_2200 = vdivps_avx(local_2000,auVar6);
        *local_2360 = local_2200;
        local_2360 = local_2360 + 1;
        _local_1f80 = local_2000;
        _local_1b60 = auVar15;
        local_1960 = local_1aa0;
        uStack_1958 = uStack_1a98;
        uStack_1950 = uStack_1a90;
        uStack_1948 = uStack_1a88;
        local_1760 = local_2160;
        uStack_1758 = uStack_2158;
        uStack_1750 = uStack_2150;
        uStack_1748 = uStack_2148;
        local_16c0 = local_1720;
        local_167c = local_1680;
        local_1678 = local_1680;
        local_1674 = local_1680;
        local_1670 = local_1680;
        local_166c = local_1680;
        local_1668 = local_1680;
        local_1664 = local_1680;
        local_1520 = local_c60._0_8_;
        uStack_1518 = local_c60._8_8_;
        uStack_1510 = local_c70._0_8_;
        uStack_1508 = local_c70._8_8_;
        local_1340 = local_1360;
        uStack_1338 = uStack_1358;
        uStack_1330 = uStack_1350;
        uStack_1328 = uStack_1348;
        local_12c0 = local_1b80;
        uStack_12b8 = uStack_1b78;
        uStack_12b0 = uStack_1b70;
        uStack_12a8 = uStack_1b68;
        local_1280 = uVar7;
        uStack_1278 = uVar8;
        uStack_1270 = uVar9;
        uStack_1268 = uVar10;
      }
      for (; local_23ac + 3 < local_2240; local_23ac = local_23ac + 4) {
        local_2100 = local_2360;
        local_20a0 = *(undefined8 *)*local_2360;
        uStack_2098 = *(undefined8 *)(*local_2360 + 8);
        local_20d8 = local_2360;
        local_9d4 = 0x3f800000;
        local_9f0 = 0x3f800000;
        local_20b0 = 0x3f8000003f800000;
        uStack_20a8 = 0x3f8000003f800000;
        local_9a0._8_8_ = 0x3f8000003f800000;
        local_9a0._0_8_ = 0x3f8000003f800000;
        local_4b0 = ZEXT816(0) << 0x20;
        local_4c0 = 0;
        local_480._8_8_ = SUB168(ZEXT816(0),4);
        uStack_4b8 = local_480._8_8_;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = local_480._8_8_;
        auVar2 = vsubps_avx(auVar48 << 0x40,*(undefined1 (*) [16])*local_2360);
        local_740 = 0x3f8000003f800000;
        uStack_738 = 0x3f8000003f800000;
        local_700._0_8_ = auVar2._0_8_;
        local_460 = local_700._0_8_;
        local_700._8_8_ = auVar2._8_8_;
        uStack_458 = local_700._8_8_;
        local_470 = 0x42b0c0a542b0c0a5;
        uStack_468 = 0x42b0c0a542b0c0a5;
        auVar36._8_8_ = 0x42b0c0a542b0c0a5;
        auVar36._0_8_ = 0x42b0c0a542b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar36);
        local_700._0_8_ = auVar2._0_8_;
        local_420 = local_700._0_8_;
        local_700._8_8_ = auVar2._8_8_;
        uStack_418 = local_700._8_8_;
        local_430 = 0xc2b0c0a5c2b0c0a5;
        uStack_428 = 0xc2b0c0a5c2b0c0a5;
        auVar38._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar38);
        local_700._0_8_ = auVar3._0_8_;
        uVar7 = local_700._0_8_;
        local_700._8_8_ = auVar3._8_8_;
        uVar8 = local_700._8_8_;
        local_2b0 = 0x3fb8aa3b3fb8aa3b;
        uStack_2a8 = 0x3fb8aa3b3fb8aa3b;
        local_2a0._0_4_ = auVar3._0_4_;
        local_2a0._4_4_ = auVar3._4_4_;
        uStack_298._0_4_ = auVar3._8_4_;
        uStack_298._4_4_ = auVar3._12_4_;
        local_720._4_4_ = local_2a0._4_4_ * 1.442695;
        local_720._0_4_ = (float)local_2a0 * 1.442695;
        uStack_718._0_4_ = (float)uStack_298 * 1.442695;
        uStack_718._4_4_ = uStack_298._4_4_ * 1.442695;
        local_5c0 = local_720;
        uStack_5b8 = uStack_718;
        local_670 = 0x3f0000003f000000;
        uStack_668 = 0x3f0000003f000000;
        local_720._0_4_ = (float)local_2a0 * 1.442695 + 0.5;
        local_720._4_4_ = local_2a0._4_4_ * 1.442695 + 0.5;
        fVar52 = (float)uStack_298 * 1.442695 + 0.5;
        fVar53 = uStack_298._4_4_ * 1.442695 + 0.5;
        uStack_718._0_4_ = fVar52;
        uStack_718._4_4_ = fVar53;
        local_120 = local_720;
        uStack_118 = uStack_718;
        local_730._4_4_ = (int)(float)local_720._4_4_;
        local_730._0_4_ = (int)(float)local_720._0_4_;
        local_730._8_4_ = (int)fVar52;
        local_730._12_4_ = (int)fVar53;
        local_f0 = local_730._0_8_;
        uStack_e8 = local_730._8_8_;
        auVar40._8_8_ = local_730._8_8_;
        auVar40._0_8_ = local_730._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar40);
        local_710 = auVar1._0_8_;
        local_c0 = local_710;
        uStack_708 = auVar1._8_8_;
        uStack_b8 = uStack_708;
        local_d0 = local_720;
        uStack_c8 = uStack_718;
        auVar42._8_8_ = uStack_718;
        auVar42._0_8_ = local_720;
        auVar2 = vcmpps_avx(auVar42,auVar1,1);
        local_750._0_8_ = auVar2._0_8_;
        local_80 = local_750._0_8_;
        local_750._8_8_ = auVar2._8_8_;
        uStack_78 = local_750._8_8_;
        local_90 = 0x3f8000003f800000;
        uStack_88 = 0x3f8000003f800000;
        auVar44._8_8_ = 0x3f8000003f800000;
        auVar44._0_8_ = 0x3f8000003f800000;
        local_750 = vpand_avx(auVar2,auVar44);
        local_560 = local_710;
        uStack_558 = uStack_708;
        local_570 = local_750._0_8_;
        uStack_568 = local_750._8_8_;
        _local_720 = vsubps_avx(auVar1,local_750);
        local_2d0 = 0x3f3180003f318000;
        uStack_2c8 = 0x3f3180003f318000;
        local_2c0._0_4_ = local_720._0_4_;
        local_2c0._4_4_ = local_720._4_4_;
        uStack_2b8._0_4_ = local_720._8_4_;
        uStack_2b8._4_4_ = local_720._12_4_;
        local_710 = CONCAT44(local_2c0._4_4_ * 0.6933594,(float)local_2c0 * 0.6933594);
        uStack_708._0_4_ = (float)uStack_2b8 * 0.6933594;
        uStack_708._4_4_ = uStack_2b8._4_4_ * 0.6933594;
        local_2e0 = local_720;
        uStack_2d8 = uStack_718;
        local_2f0 = 0xb95e8083b95e8083;
        uStack_2e8 = 0xb95e8083b95e8083;
        local_580 = local_700._0_8_;
        uStack_578 = local_700._8_8_;
        local_590 = local_710;
        uStack_588 = uStack_708;
        auVar33._8_8_ = uStack_708;
        auVar33._0_8_ = local_710;
        auVar2 = vsubps_avx(auVar3,auVar33);
        local_700._0_8_ = auVar2._0_8_;
        local_5a0 = local_700._0_8_;
        local_700._8_8_ = auVar2._8_8_;
        uStack_598 = local_700._8_8_;
        local_5b0 = CONCAT44(local_2c0._4_4_ * -0.00021219444,(float)local_2c0 * -0.00021219444);
        uStack_5a8 = CONCAT44(uStack_2b8._4_4_ * -0.00021219444,(float)uStack_2b8 * -0.00021219444);
        auVar32._8_8_ = uStack_5a8;
        auVar32._0_8_ = local_5b0;
        local_700 = vsubps_avx(auVar2,auVar32);
        local_310 = local_700._0_8_;
        uStack_308 = local_700._8_8_;
        local_300._0_4_ = local_700._0_4_;
        local_300._4_4_ = local_700._4_4_;
        uStack_2f8._0_4_ = local_700._8_4_;
        uStack_2f8._4_4_ = local_700._12_4_;
        local_760 = (float)local_300 * (float)local_300;
        fStack_75c = local_300._4_4_ * local_300._4_4_;
        fStack_758 = (float)uStack_2f8 * (float)uStack_2f8;
        fStack_754 = uStack_2f8._4_4_ * uStack_2f8._4_4_;
        local_320 = 0x3950696739506967;
        uStack_318 = 0x3950696739506967;
        local_330 = local_700._0_8_;
        uStack_328 = local_700._8_8_;
        local_5e0 = CONCAT44(local_300._4_4_ * 0.00019875691,(float)local_300 * 0.00019875691);
        uStack_5d8 = CONCAT44(uStack_2f8._4_4_ * 0.00019875691,(float)uStack_2f8 * 0.00019875691);
        local_5f0 = 0x3ab743ce3ab743ce;
        uStack_5e8 = 0x3ab743ce3ab743ce;
        local_770 = (float)local_300 * 0.00019875691 + 0.0013981999;
        fStack_76c = local_300._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_768 = (float)uStack_2f8 * 0.00019875691 + 0.0013981999;
        fStack_764 = uStack_2f8._4_4_ * 0.00019875691 + 0.0013981999;
        local_340 = CONCAT44(fStack_76c,local_770);
        uStack_338 = CONCAT44(fStack_764,fStack_768);
        local_350 = local_700._0_8_;
        uStack_348 = local_700._8_8_;
        local_770 = local_770 * (float)local_300;
        fStack_76c = fStack_76c * local_300._4_4_;
        fStack_768 = fStack_768 * (float)uStack_2f8;
        fStack_764 = fStack_764 * uStack_2f8._4_4_;
        local_600 = CONCAT44(fStack_76c,local_770);
        uStack_5f8 = CONCAT44(fStack_764,fStack_768);
        local_610 = 0x3c0889083c088908;
        uStack_608 = 0x3c0889083c088908;
        local_770 = local_770 + 0.008333452;
        fStack_76c = fStack_76c + 0.008333452;
        fStack_768 = fStack_768 + 0.008333452;
        fStack_764 = fStack_764 + 0.008333452;
        local_360 = CONCAT44(fStack_76c,local_770);
        uStack_358 = CONCAT44(fStack_764,fStack_768);
        local_370 = local_700._0_8_;
        uStack_368 = local_700._8_8_;
        local_770 = local_770 * (float)local_300;
        fStack_76c = fStack_76c * local_300._4_4_;
        fStack_768 = fStack_768 * (float)uStack_2f8;
        fStack_764 = fStack_764 * uStack_2f8._4_4_;
        local_620 = CONCAT44(fStack_76c,local_770);
        uStack_618 = CONCAT44(fStack_764,fStack_768);
        local_630 = 0x3d2aa9c13d2aa9c1;
        uStack_628 = 0x3d2aa9c13d2aa9c1;
        local_770 = local_770 + 0.041665796;
        fStack_76c = fStack_76c + 0.041665796;
        fStack_768 = fStack_768 + 0.041665796;
        fStack_764 = fStack_764 + 0.041665796;
        local_380 = CONCAT44(fStack_76c,local_770);
        uStack_378 = CONCAT44(fStack_764,fStack_768);
        local_390 = local_700._0_8_;
        uStack_388 = local_700._8_8_;
        local_770 = local_770 * (float)local_300;
        fStack_76c = fStack_76c * local_300._4_4_;
        fStack_768 = fStack_768 * (float)uStack_2f8;
        fStack_764 = fStack_764 * uStack_2f8._4_4_;
        local_640 = CONCAT44(fStack_76c,local_770);
        uStack_638 = CONCAT44(fStack_764,fStack_768);
        local_650 = 0x3e2aaaaa3e2aaaaa;
        uStack_648 = 0x3e2aaaaa3e2aaaaa;
        local_770 = local_770 + 0.16666666;
        fStack_76c = fStack_76c + 0.16666666;
        fStack_768 = fStack_768 + 0.16666666;
        fStack_764 = fStack_764 + 0.16666666;
        local_3a0 = CONCAT44(fStack_76c,local_770);
        uStack_398 = CONCAT44(fStack_764,fStack_768);
        local_3b0 = local_700._0_8_;
        uStack_3a8 = local_700._8_8_;
        local_770 = local_770 * (float)local_300;
        fStack_76c = fStack_76c * local_300._4_4_;
        fStack_768 = fStack_768 * (float)uStack_2f8;
        fStack_764 = fStack_764 * uStack_2f8._4_4_;
        local_660 = CONCAT44(fStack_76c,local_770);
        uStack_658 = CONCAT44(fStack_764,fStack_768);
        local_770 = local_770 + 0.5;
        fStack_76c = fStack_76c + 0.5;
        fStack_768 = fStack_768 + 0.5;
        fStack_764 = fStack_764 + 0.5;
        local_3c0 = CONCAT44(fStack_76c,local_770);
        uStack_3b8 = CONCAT44(fStack_764,fStack_768);
        local_3d0 = CONCAT44(fStack_75c,local_760);
        uStack_3c8 = CONCAT44(fStack_754,fStack_758);
        local_770 = local_770 * local_760;
        fStack_76c = fStack_76c * fStack_75c;
        fStack_768 = fStack_768 * fStack_758;
        fStack_764 = fStack_764 * fStack_754;
        local_680 = CONCAT44(fStack_76c,local_770);
        uStack_678 = CONCAT44(fStack_764,fStack_768);
        local_690 = local_700._0_8_;
        uStack_688 = local_700._8_8_;
        local_770 = local_770 + (float)local_300;
        fStack_76c = fStack_76c + local_300._4_4_;
        fStack_768 = fStack_768 + (float)uStack_2f8;
        fStack_764 = fStack_764 + uStack_2f8._4_4_;
        local_6a0 = CONCAT44(fStack_76c,local_770);
        uStack_698 = CONCAT44(fStack_764,fStack_768);
        local_6b0 = 0x3f8000003f800000;
        uStack_6a8 = 0x3f8000003f800000;
        local_770 = local_770 + 1.0;
        fStack_76c = fStack_76c + 1.0;
        fStack_768 = fStack_768 + 1.0;
        fStack_764 = fStack_764 + 1.0;
        local_130 = local_720;
        uStack_128 = uStack_718;
        local_730._4_4_ = (int)local_2c0._4_4_;
        local_730._0_4_ = (int)(float)local_2c0;
        local_730._8_4_ = (int)(float)uStack_2b8;
        local_730._12_4_ = (int)uStack_2b8._4_4_;
        local_6e0 = local_730._0_8_;
        uStack_6d8 = local_730._8_8_;
        local_6f0 = 0x7f0000007f;
        uStack_6e8 = 0x7f0000007f;
        auVar31._8_8_ = local_730._8_8_;
        auVar31._0_8_ = local_730._0_8_;
        auVar30._8_8_ = 0x7f0000007f;
        auVar30._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar31,auVar30);
        local_730._0_8_ = auVar2._0_8_;
        local_6c0 = local_730._0_8_;
        local_730._8_8_ = auVar2._8_8_;
        uStack_6b8 = local_730._8_8_;
        local_6c4 = 0x17;
        local_730 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_50 = local_730._0_8_;
        uStack_48 = local_730._8_8_;
        local_780 = local_730._0_8_;
        uStack_778 = local_730._8_8_;
        local_3e0._4_4_ = fStack_76c;
        local_3e0._0_4_ = local_770;
        local_3e0._8_4_ = fStack_768;
        local_3e0._12_4_ = fStack_764;
        local_3f0._0_4_ = local_730._0_4_;
        local_3f0._4_4_ = local_730._4_4_;
        uStack_3e8._0_4_ = local_730._8_4_;
        uStack_3e8._4_4_ = local_730._12_4_;
        local_770 = local_770 * (float)local_3f0;
        fStack_76c = fStack_76c * local_3f0._4_4_;
        fStack_768 = fStack_768 * (float)uStack_3e8;
        fStack_764 = fStack_764 * uStack_3e8._4_4_;
        local_970 = CONCAT44(fStack_76c,local_770);
        uStack_968 = CONCAT44(fStack_764,fStack_768);
        local_9b0 = local_770 + 1.0;
        fStack_9ac = fStack_76c + 1.0;
        fStack_9a8 = fStack_768 + 1.0;
        fStack_9a4 = fStack_764 + 1.0;
        auVar27._4_4_ = fStack_9ac;
        auVar27._0_4_ = local_9b0;
        auVar27._8_4_ = fStack_9a8;
        auVar27._12_4_ = fStack_9a4;
        local_20f0 = vdivps_avx(local_9a0,auVar27);
        *(undefined1 (*) [16])*local_2360 = local_20f0;
        local_2360 = (undefined1 (*) [32])(*local_2360 + 0x10);
        uStack_9ec = local_9f0;
        uStack_9e8 = local_9f0;
        uStack_9e4 = local_9f0;
        local_960 = local_9a0;
        local_5d0 = local_670;
        uStack_5c8 = uStack_668;
        local_4d0 = local_20a0;
        uStack_4c8 = uStack_2098;
        local_480 = local_4b0;
        local_3f0 = local_730._0_8_;
        uStack_3e8 = local_730._8_8_;
        local_300 = local_310;
        uStack_2f8 = uStack_308;
        local_2c0 = local_720;
        uStack_2b8 = uStack_718;
        local_2a0 = uVar7;
        uStack_298 = uVar8;
      }
      for (; local_23ac < local_2240; local_23ac = local_23ac + 1) {
        dVar51 = std::exp((double)(ulong)(*(uint *)*local_2360 ^ 0x80000000));
        *(float *)*local_2360 = 1.0 / (SUB84(dVar51,0) + 1.0);
        local_2360 = (undefined1 (*) [32])(*local_2360 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Sigmoid_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, sigmoid_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, sigmoid_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, sigmoid_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, sigmoid_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + exp(-*ptr));

            ptr++;
        }
    }

    return 0;
}